

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::applyBC
          (MLEBABecLap *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode s_mode,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  double dVar1;
  bool bVar2;
  FabType FVar3;
  int iVar4;
  int iVar5;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  undefined8 uVar18;
  int *piVar19;
  bool bVar20;
  bool bVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  undefined8 uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  double *pdVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  double *pdVar42;
  ulong uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  Periodicity PVar49;
  int k;
  int j_3;
  IntVect hi;
  IntVect low;
  MFIter mfi;
  MFItInfo mfi_info;
  FArrayBox foofab;
  int local_600;
  long local_5e8;
  Array4<double> local_5e0;
  ulong local_5a0;
  ulong local_598;
  double *local_590;
  ulong local_588;
  ulong local_580;
  long local_578;
  int local_570;
  int local_56c;
  ulong local_568;
  ulong local_560;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  double *local_548;
  undefined8 uStack_540;
  double *local_530;
  long local_528;
  ulong local_520;
  ulong local_518;
  double *local_510;
  double *local_508;
  double *local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  double *local_4d0;
  double *local_4c8;
  ulong local_4c0;
  int local_4b8;
  int local_4b4;
  Array4<const_int> local_4b0;
  long local_470;
  long local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  long local_438;
  long local_430;
  long local_428;
  uint local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  ulong local_408;
  ulong local_400;
  Array4<const_int> local_3f8;
  Array4<const_double> local_3b8;
  Box local_378;
  undefined4 uStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  FabType local_314;
  double local_310 [4];
  Array4<const_int> local_2f0;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  Array4<const_double> local_298;
  Array4<const_double> local_258;
  int local_218;
  int local_214;
  double local_210;
  double local_208;
  double local_200;
  FabArray<amrex::FArrayBox> *local_1f8;
  FabArray<amrex::EBCellFlagFab> *local_1f0;
  long local_1e8;
  double *local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c0;
  long local_1b8;
  double *local_1b0;
  long local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  FabSet *local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  undefined1 local_15c [20];
  uint local_148;
  IndexType local_144;
  long local_140;
  long local_138;
  double *local_130;
  FabArray<amrex::IArrayBox> *local_128;
  ulong local_120;
  long *local_118;
  long *local_110;
  MFIter local_108;
  undefined8 local_a8 [3];
  MFItInfo local_8c;
  BaseFab<double> local_78;
  int iVar6;
  
  local_1f8 = &in->super_FabArray<amrex::FArrayBox>;
  local_41c = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  lVar22 = (long)mglev;
  if (!skip_fillboundary) {
    PVar49 = Geometry::periodicity
                       ((Geometry *)
                        (lVar22 * 200 +
                        *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom
                                  .
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    local_378.smallend.vect[0] = PVar49.period.vect[0];
    local_378.smallend.vect[1] = PVar49.period.vect[1];
    local_378.smallend.vect[2] = PVar49.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_1f8,0,local_41c,(Periodicity *)&local_378,false);
  }
  this->m_is_eb_inhomog = (uint)(s_mode == Solution);
  uVar15 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.maxorder;
  local_408 = (ulong)uVar15;
  if (4 < (int)uVar15) {
    Assert_host("imaxorder <= 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,0x3f9,"\"MLEBABecLap::applyBC: maxorder too high\"");
  }
  local_138 = lVar22 * 0x900 +
              *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  lVar14 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar26 = lVar22 * 200;
  local_200 = *(double *)(lVar14 + 0x38 + lVar26);
  local_208 = *(double *)(lVar14 + 0x40 + lVar26);
  local_210 = *(double *)(lVar14 + 0x48 + lVar26);
  local_128 = (FabArray<amrex::IArrayBox> *)
              (lVar22 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  local_140 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_bcondloc.
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar22 * 8);
  lVar22 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar22 * 8);
  if (lVar22 == 0) {
    lVar22 = 0;
  }
  else {
    lVar22 = __dynamic_cast(lVar22,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar22 == 0) {
    local_1f0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
  }
  else {
    local_1f0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar22 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar22 + 0xd8));
  }
  local_378.bigend.vect[1] = 0;
  local_378.bigend.vect[2] = 0;
  local_378.btype.itype = 0;
  local_378.smallend.vect[0] = 0;
  local_378.smallend.vect[1] = 0;
  local_378.smallend.vect[2] = 0;
  local_378.bigend.vect[0] = 0;
  FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_378,local_41c,true,false,(Arena *)0x0);
  local_198._8_8_ = local_78.dptr;
  local_218 = local_78.nvar;
  local_1e8 = (long)local_78.domain.smallend.vect[2];
  local_8c.do_tiling = false;
  local_8c.num_streams = Gpu::Device::max_gpu_streams;
  local_8c.tilesize.vect[0] = 0;
  local_8c.tilesize.vect[1] = 0;
  local_8c.tilesize.vect[2] = 0;
  local_8c.dynamic = true;
  local_8c.device_sync = true;
  MFIter::MFIter(&local_108,&local_1f8->super_FabArrayBase,&local_8c);
  if (local_108.currentIndex < local_108.endIndex) {
    local_1a8 = (long)local_78.domain.bigend.vect[2] + 1;
    local_1b0 = (double *)
                (((long)local_78.domain.bigend.vect[0] - (long)local_78.domain.smallend.vect[0]) + 1
                );
    local_1a0 = (((long)local_78.domain.bigend.vect[1] + 1) - (long)local_78.domain.smallend.vect[1]
                ) * (long)local_1b0;
    local_1b8 = (local_1a8 - local_1e8) * local_1a0;
    local_198._4_4_ = local_78.domain.smallend.vect[1];
    local_198._0_4_ = local_78.domain.smallend.vect[0];
    local_1c0 = (long)local_78.domain.bigend.vect[0] + 1U & 0xffffffff |
                (long)local_78.domain.bigend.vect[1] + 1 << 0x20;
    local_188 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
    local_4d8 = (ulong)((int)local_408 - 1);
    local_120 = (ulong)local_41c;
    do {
      BATransformer::operator()
                ((Box *)local_15c,&((local_108.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_108.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_108.currentIndex] * 0x1c +
                        *(long *)&((((local_108.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_5e0,local_1f8,&local_108);
      FVar3 = regular;
      if (local_1f0 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar19 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar19 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        FVar3 = EBCellFlagFab::getType
                          ((local_1f0->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar19],(Box *)local_15c);
      }
      if (FVar3 != covered) {
        piVar19 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar19 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        piVar17 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar17 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        local_110 = (long *)((long)*piVar19 * 0x18 + *(long *)(local_140 + 0x200));
        local_118 = (long *)((long)*piVar17 * 0x18 + *(long *)(local_140 + 0xf0));
        lVar22 = 0;
        local_314 = FVar3;
        do {
          FVar3 = local_314;
          local_378.smallend.vect[2] = local_15c._8_4_;
          local_378.smallend.vect[0] = (int)local_15c._0_8_;
          local_378.smallend.vect[1] = SUB84(local_15c._0_8_,4);
          local_3f8.jstride._0_4_ = local_148;
          local_3f8.p = (int *)local_15c._12_8_;
          iVar4 = local_378.smallend.vect[lVar22] + -1;
          local_378.smallend.vect[lVar22] = iVar4;
          *(int *)((long)&local_3f8.p + lVar22 * 4) = iVar4;
          uVar15 = local_378.smallend.vect[2];
          uVar29 = local_378.smallend.vect[1];
          uVar28 = local_378.smallend.vect[0];
          uVar16 = (uint)local_3f8.jstride;
          piVar19 = local_3f8.p;
          local_4e0 = (ulong)local_3f8.p & 0xffffffff;
          uVar30 = local_3f8.p._4_4_;
          local_378.smallend.vect[2] = local_15c._8_4_;
          local_378.smallend.vect[0] = (int)local_15c._0_8_;
          local_378.smallend.vect[1] = SUB84(local_15c._0_8_,4);
          local_3f8.jstride._0_4_ = local_148;
          local_3f8.p = (int *)local_15c._12_8_;
          local_2f0.p = (int *)(CONCAT44(local_144.itype >> 1,local_144.itype) & 0x100000001);
          local_2f0.jstride._0_4_ = local_144.itype >> 2 & 1;
          iVar4 = (~*(uint *)((long)&local_2f0.p + lVar22 * 4) & 1) +
                  *(int *)((long)&local_3f8.p + lVar22 * 4);
          local_378.smallend.vect[lVar22] = iVar4;
          *(int *)((long)&local_3f8.p + lVar22 * 4) = iVar4;
          lVar14 = local_138;
          local_600 = local_378.smallend.vect[0];
          local_4e8 = (ulong)local_3f8.p & 0xffffffff;
          uVar11 = local_378.smallend.vect[2];
          uVar9 = local_378.smallend.vect[1];
          uVar12 = (uint)local_3f8.jstride;
          uVar10 = local_3f8.p._4_4_;
          if (FVar3 != regular) {
            iVar4 = 1;
            iVar39 = (int)lVar22;
            uVar18 = 0x100000000;
            uVar11 = 1;
            if (iVar39 != 0) {
              if (iVar39 != 1) {
                uVar18 = 0x100000001;
              }
              else {
                uVar18 = 1;
              }
              uVar11 = (uint)(iVar39 == 1);
            }
            if (iVar39 == 0) {
              uVar27 = 0x100000000;
            }
            else if (iVar39 == 1) {
              uVar27 = 1;
            }
            else {
              uVar27 = 0x100000001;
              iVar4 = 0;
            }
            uVar28 = uVar28 - (int)uVar18;
            local_4e0 = (ulong)(uint)((int)piVar19 + (int)uVar18);
            iVar39 = (int)((ulong)uVar18 >> 0x20);
            uVar29 = uVar29 - iVar39;
            uVar30 = uVar30 + iVar39;
            uVar15 = uVar15 - uVar11;
            uVar16 = uVar16 + uVar11;
            local_600 = local_378.smallend.vect[0] - (int)uVar27;
            local_4e8 = (ulong)(uint)((int)local_3f8.p + (int)uVar27);
            iVar39 = (int)((ulong)uVar27 >> 0x20);
            uVar9 = local_378.smallend.vect[1] - iVar39;
            uVar10 = local_3f8.p._4_4_ + iVar39;
            uVar11 = local_378.smallend.vect[2] - iVar4;
            uVar12 = (uint)local_3f8.jstride + iVar4;
          }
          local_4f0 = (ulong)uVar30;
          local_4f8 = (ulong)uVar10;
          local_518 = (ulong)uVar16;
          local_520 = (ulong)uVar12;
          local_568 = (ulong)uVar28;
          local_580 = (ulong)uVar9;
          local_588 = (ulong)uVar11;
          local_598 = (ulong)uVar29;
          local_5a0 = (ulong)uVar15;
          iVar4 = *(int *)(local_15c + lVar22 * 4 + 0xc);
          iVar39 = *(int *)(local_15c + lVar22 * 4);
          local_438 = lVar22;
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_3f8,(FabArray<amrex::Mask> *)(lVar22 * 0x180 + local_138),&local_108);
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_2f0,(FabArray<amrex::Mask> *)((lVar22 + 3) * 0x180 + lVar14),&local_108)
          ;
          if (bndry == (MLMGBndry *)0x0) {
            local_258.p = (double *)local_198._8_8_;
            local_258.jstride = (Long)local_1b0;
            local_258.kstride = local_1a0;
            local_258.nstride = local_1b8;
            local_258.begin.x = local_198._0_4_;
            local_258.begin.y = local_198._4_4_;
            local_258.begin.z = (int)local_1e8;
            local_258.end.x = (undefined4)local_1c0;
            local_258.end.y = local_1c0._4_4_;
            local_258.end.z = (int)local_1a8;
            local_258.ncomp = local_218;
            local_298.p = (double *)local_198._8_8_;
            local_298.jstride = (Long)local_1b0;
            local_298.kstride = local_1a0;
            local_298.nstride = local_1b8;
            local_298.begin.x = local_198._0_4_;
            local_298.begin.y = local_198._4_4_;
            local_298.begin.z = (int)local_1e8;
            local_298.end.x = (undefined4)local_1c0;
            local_298.end.y = local_1c0._4_4_;
            local_298.end.z = (int)local_1a8;
            local_298.ncomp = local_218;
            uVar40 = local_4d8;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_258,(FabArray<amrex::FArrayBox> *)(local_188 + lVar22),&local_108);
            uVar40 = local_4d8;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_298,(FabArray<amrex::FArrayBox> *)(local_188 + lVar22 + 3),&local_108)
            ;
          }
          if (0 < (int)local_41c) {
            uVar15 = (iVar4 - iVar39) + 2;
            uVar43 = (ulong)uVar15;
            if ((int)local_408 < (int)uVar15) {
              uVar43 = local_408 & 0xffffffff;
            }
            local_410 = (int)local_598;
            local_554 = local_410 + 1;
            iVar4 = (int)uVar43;
            local_414 = (int)local_580;
            local_4b4 = local_414 + -1;
            local_2a0 = (long)(iVar4 + -2);
            local_528 = (long)local_410;
            local_418 = (int)local_568;
            local_2a8 = (long)local_418;
            iVar39 = (int)local_4e0 + 1;
            local_2b0 = (long)local_600;
            local_40c = (int)local_4e8 + 1;
            local_54c = (int)local_4f0 + 1;
            local_530 = (double *)(long)local_414;
            local_550 = (int)local_4f8 + 1;
            uVar24 = (ulong)(uint)(iVar39 - local_418);
            local_400 = (ulong)(uint)(local_40c - local_600);
            local_410 = local_54c - local_410;
            local_414 = local_550 - local_414;
            local_418 = local_418 + 1;
            local_558 = (int)local_5a0 + 1;
            local_4b8 = (int)local_588 + -1;
            local_458 = (double *)(long)(int)local_5a0;
            local_56c = (int)local_518 + 1;
            local_460 = (double *)(long)(int)local_588;
            local_570 = (int)local_520 + 1;
            local_428 = local_2a8 * 8;
            local_468 = local_2a8 * 4;
            local_430 = local_2b0 * 8;
            local_470 = local_2b0 * 4;
            local_168 = (long)local_418;
            local_178 = (long)local_418 * 4;
            local_214 = local_600 + -1;
            local_170 = (long)local_214;
            local_180 = (long)local_214 * 4;
            local_578 = 0;
            uVar8 = 0;
            local_560 = uVar24;
            do {
              dVar44 = 1.0;
              dVar47 = 1.0;
              lVar14 = uVar8 * 0x18 + *local_118;
              lVar22 = uVar8 * 0x30 + *local_110;
              iVar37 = *(int *)(lVar14 + local_438 * 4);
              iVar35 = *(int *)(lVar14 + 0xc + local_438 * 4);
              pdVar33 = *(double **)(lVar22 + local_438 * 8);
              dVar45 = *(double *)(lVar22 + 0x18 + local_438 * 8);
              local_500 = (double *)CONCAT44(local_500._4_4_,iVar35);
              iVar23 = (int)uVar24;
              local_4c0 = uVar8;
              if (local_314 == regular) {
                iVar7 = (int)local_598;
                iVar5 = (int)local_518;
                iVar25 = (int)local_4e0;
                iVar6 = (int)local_520;
                iVar13 = (int)local_4e8;
                iVar31 = (int)local_400;
                if ((int)local_438 == 1) {
                  if (iVar37 == 0x65) {
                    dVar46 = -(double)pdVar33 * local_208;
                    local_378.smallend.vect[0] = SUB84(dVar46,0);
                    local_378.smallend.vect[1] = (int)((ulong)dVar46 >> 0x20);
                    local_378.smallend.vect[2] = 0;
                    local_378.bigend.vect[0] = 0x3fe00000;
                    local_378.bigend.vect[1] = 0;
                    local_378.bigend.vect[2] = 0x3ff80000;
                    local_378.btype.itype = 0;
                    uStack_35c = 0x40040000;
                    local_3b8.kstride = 0;
                    local_3b8.nstride = 0;
                    local_3b8.p = (double *)0x0;
                    local_3b8.jstride = 0;
                    local_378.smallend.vect._0_8_ = dVar46;
                    if (0 < iVar4) {
                      uVar40 = 0;
                      do {
                        uVar24 = 0;
                        dVar46 = dVar47;
                        dVar48 = dVar44;
                        do {
                          if (uVar40 != uVar24) {
                            dVar1 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                            dVar46 = dVar46 * (-0.5 - dVar1);
                            dVar48 = dVar48 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                              dVar1);
                          }
                          uVar24 = uVar24 + 1;
                        } while (uVar43 != uVar24);
                        (&local_3b8.p)[uVar40] = (double *)(dVar46 / dVar48);
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != uVar43);
                    }
                    uVar24 = local_560;
                    uVar40 = local_4d8;
                    if ((int)local_5a0 <= iVar5) {
                      lVar22 = (long)iVar7;
                      local_590 = (double *)local_3f8.kstride;
                      pdVar33 = local_458;
                      do {
                        if ((int)local_568 <= iVar25) {
                          local_548 = local_5e0.p +
                                      ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride
                                      + local_5e0.nstride * uVar8;
                          lVar26 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                          lVar14 = local_2a8;
                          do {
                            if (0 < local_3f8.p
                                    [(lVar22 - local_3f8.begin.y) *
                                     CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) +
                                     ((long)pdVar33 - (long)local_3f8.begin.z) * local_3f8.kstride +
                                     (lVar14 - local_3f8.begin.x)]) {
                              dVar46 = 0.0;
                              if (1 < iVar4) {
                                uVar40 = 1;
                                do {
                                  dVar46 = dVar46 + local_548[(lVar14 - local_5e0.begin.x) +
                                                              ((iVar7 - local_5e0.begin.y) +
                                                              (int)uVar40) * local_5e0.jstride] *
                                                    (double)(&local_3b8.p)[uVar40];
                                  uVar40 = uVar40 + 1;
                                } while (uVar43 != uVar40);
                              }
                              lVar36 = lVar14 - local_5e0.begin.x;
                              local_548[lVar26 + lVar36] = dVar46;
                              if (bc_mode == Inhomogeneous) {
                                local_548[lVar26 + lVar36] =
                                     local_258.p
                                     [(lVar22 - local_258.begin.y) * local_258.jstride +
                                      ((long)pdVar33 - (long)local_258.begin.z) * local_258.kstride
                                      + local_258.nstride * uVar8 + (lVar14 - local_258.begin.x)] *
                                     (double)local_3b8.p + dVar46;
                              }
                            }
                            lVar14 = lVar14 + 1;
                          } while (iVar39 != (int)lVar14);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        uVar40 = local_4d8;
                      } while (local_56c != (int)pdVar33);
                    }
                  }
                  else if (iVar37 == 0x66) {
                    if ((int)local_5a0 <= iVar5) {
                      lVar22 = (long)local_3f8.p +
                               ((long)local_458 - (long)local_3f8.begin.z) * local_3f8.kstride * 4 +
                               (long)(iVar7 - local_3f8.begin.y) *
                               CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) * 4 +
                               (long)local_3f8.begin.x * -4 + local_468;
                      pdVar33 = local_458;
                      do {
                        if ((int)local_568 <= iVar25) {
                          lVar26 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                          lVar14 = 0;
                          do {
                            if (0 < *(int *)(lVar22 + lVar14 * 4)) {
                              *(undefined8 *)
                               ((long)local_5e0.p +
                               lVar14 * 8 +
                               local_5e0.jstride * 8 * (long)(iVar7 - local_5e0.begin.y) +
                               lVar26 * 8 + local_5e0.nstride * local_578 +
                               (long)local_5e0.begin.x * -8 + local_428) =
                                   *(undefined8 *)
                                    ((long)local_5e0.p +
                                    lVar14 * 8 +
                                    (long)(local_554 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                    lVar26 * 8 + local_5e0.nstride * local_578 +
                                    (long)local_5e0.begin.x * -8 + local_428);
                            }
                            lVar14 = lVar14 + 1;
                          } while (iVar23 != (int)lVar14);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar22 = lVar22 + local_3f8.kstride * 4;
                      } while (local_56c != (int)pdVar33);
                    }
                  }
                  else if ((iVar37 == 0x67) && ((int)local_5a0 <= iVar5)) {
                    lVar22 = (long)local_3f8.p +
                             ((long)local_458 - (long)local_3f8.begin.z) * local_3f8.kstride * 4 +
                             (long)(iVar7 - local_3f8.begin.y) *
                             CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) * 4 +
                             (long)local_3f8.begin.x * -4 + local_468;
                    pdVar33 = local_458;
                    do {
                      if ((int)local_568 <= iVar25) {
                        lVar26 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                        lVar14 = 0;
                        do {
                          if (0 < *(int *)(lVar22 + lVar14 * 4)) {
                            *(ulong *)((long)local_5e0.p +
                                      lVar14 * 8 +
                                      local_5e0.jstride * 8 * (long)(iVar7 - local_5e0.begin.y) +
                                      lVar26 * 8 + local_5e0.nstride * local_578 +
                                      (long)local_5e0.begin.x * -8 + local_428) =
                                 *(ulong *)((long)local_5e0.p +
                                           lVar14 * 8 +
                                           (long)(local_554 - local_5e0.begin.y) *
                                           local_5e0.jstride * 8 + lVar26 * 8 +
                                           local_5e0.nstride * local_578 +
                                           (long)local_5e0.begin.x * -8 + local_428) ^
                                 0x8000000000000000;
                          }
                          lVar14 = lVar14 + 1;
                        } while (iVar23 != (int)lVar14);
                      }
                      pdVar33 = (double *)((long)pdVar33 + 1);
                      lVar22 = lVar22 + local_3f8.kstride * 4;
                    } while (local_56c != (int)pdVar33);
                  }
                  if (iVar35 == 0x65) {
                    dVar45 = -dVar45 * local_208;
                    local_378.smallend.vect[0] = SUB84(dVar45,0);
                    local_378.smallend.vect[1] = (int)((ulong)dVar45 >> 0x20);
                    local_378.smallend.vect[2] = 0;
                    local_378.bigend.vect[0] = 0x3fe00000;
                    local_378.bigend.vect[1] = 0;
                    local_378.bigend.vect[2] = 0x3ff80000;
                    local_378.btype.itype = 0;
                    uStack_35c = 0x40040000;
                    local_3b8.kstride = 0;
                    local_3b8.nstride = 0;
                    local_3b8.p = (double *)0x0;
                    local_3b8.jstride = 0;
                    local_378.smallend.vect._0_8_ = dVar45;
                    if (0 < iVar4) {
                      uVar40 = 0;
                      do {
                        uVar24 = 0;
                        dVar45 = dVar47;
                        dVar46 = dVar44;
                        do {
                          if (uVar40 != uVar24) {
                            dVar48 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                            dVar45 = dVar45 * (-0.5 - dVar48);
                            dVar46 = dVar46 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                              dVar48);
                          }
                          uVar24 = uVar24 + 1;
                        } while (uVar43 != uVar24);
                        (&local_3b8.p)[uVar40] = (double *)(dVar45 / dVar46);
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != uVar43);
                    }
                    uVar24 = local_560;
                    uVar40 = local_4d8;
                    if ((int)local_588 <= iVar6) {
                      lVar22 = (long)(int)local_580;
                      local_590 = (double *)local_2f0.kstride;
                      local_548 = local_460;
                      do {
                        if (local_600 <= iVar13) {
                          lVar38 = ((long)local_548 - (long)local_5e0.begin.z) * local_5e0.kstride;
                          lVar26 = local_5e0.nstride * uVar8;
                          lVar36 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                          lVar14 = local_2b0;
                          do {
                            if (0 < local_2f0.p
                                    [(lVar22 - local_2f0.begin.y) *
                                     CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) +
                                     ((long)local_548 - (long)local_2f0.begin.z) * local_2f0.kstride
                                     + (lVar14 - local_2f0.begin.x)]) {
                              dVar45 = 0.0;
                              if (1 < iVar4) {
                                uVar40 = 1;
                                iVar37 = local_4b4 - local_5e0.begin.y;
                                do {
                                  dVar45 = dVar45 + local_5e0.p
                                                    [lVar38 + lVar26 + (lVar14 - local_5e0.begin.x)
                                                                       + local_5e0.jstride * iVar37]
                                                    * (double)(&local_3b8.p)[uVar40];
                                  uVar40 = uVar40 + 1;
                                  iVar37 = iVar37 + -1;
                                } while (uVar43 != uVar40);
                              }
                              lVar41 = lVar14 - local_5e0.begin.x;
                              local_5e0.p[lVar38 + lVar26 + lVar36 + lVar41] = dVar45;
                              if (bc_mode == Inhomogeneous) {
                                local_5e0.p[lVar38 + lVar26 + lVar36 + lVar41] =
                                     local_298.p
                                     [(lVar22 - local_298.begin.y) * local_298.jstride +
                                      ((long)local_548 - (long)local_298.begin.z) *
                                      local_298.kstride +
                                      local_298.nstride * uVar8 + (lVar14 - local_298.begin.x)] *
                                     (double)local_3b8.p + dVar45;
                              }
                            }
                            lVar14 = lVar14 + 1;
                          } while (local_40c != (int)lVar14);
                        }
                        local_548 = (double *)((long)local_548 + 1);
                        uVar40 = local_4d8;
                      } while (local_570 != (int)local_548);
                    }
                  }
                  else if (iVar35 == 0x66) {
                    if ((int)local_588 <= iVar6) {
                      lVar22 = (long)local_2f0.p +
                               ((long)local_460 - (long)local_2f0.begin.z) * local_2f0.kstride * 4 +
                               (long)((int)local_580 - local_2f0.begin.y) *
                               CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) * 4 +
                               (long)local_2f0.begin.x * -4 + local_470;
                      pdVar33 = local_460;
                      do {
                        if (local_600 <= iVar13) {
                          lVar14 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                          lVar26 = 0;
                          do {
                            if (0 < *(int *)(lVar22 + lVar26 * 4)) {
                              *(undefined8 *)
                               ((long)local_5e0.p +
                               lVar26 * 8 +
                               local_5e0.jstride * 8 * (long)((int)local_580 - local_5e0.begin.y) +
                               lVar14 * 8 + local_5e0.nstride * local_578 +
                               (long)local_5e0.begin.x * -8 + local_430) =
                                   *(undefined8 *)
                                    ((long)local_5e0.p +
                                    lVar26 * 8 +
                                    (long)(~local_5e0.begin.y + (int)local_580) *
                                    local_5e0.jstride * 8 + lVar14 * 8 +
                                    local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8 +
                                    local_430);
                            }
                            lVar26 = lVar26 + 1;
                          } while (iVar31 != (int)lVar26);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar22 = lVar22 + local_2f0.kstride * 4;
                      } while (local_570 != (int)pdVar33);
                    }
                  }
                  else if ((iVar35 == 0x67) && ((int)local_588 <= iVar6)) {
                    lVar22 = (long)local_2f0.p +
                             ((long)local_460 - (long)local_2f0.begin.z) * local_2f0.kstride * 4 +
                             (long)((int)local_580 - local_2f0.begin.y) *
                             CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) * 4 +
                             (long)local_2f0.begin.x * -4 + local_470;
                    pdVar33 = local_460;
                    do {
                      if (local_600 <= iVar13) {
                        lVar14 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                        lVar26 = 0;
                        do {
                          if (0 < *(int *)(lVar22 + lVar26 * 4)) {
                            *(ulong *)((long)local_5e0.p +
                                      lVar26 * 8 +
                                      local_5e0.jstride * 8 *
                                      (long)((int)local_580 - local_5e0.begin.y) + lVar14 * 8 +
                                      local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8 +
                                      local_430) =
                                 *(ulong *)((long)local_5e0.p +
                                           lVar26 * 8 +
                                           (long)(~local_5e0.begin.y + (int)local_580) *
                                           local_5e0.jstride * 8 + lVar14 * 8 +
                                           local_5e0.nstride * local_578 +
                                           (long)local_5e0.begin.x * -8 + local_430) ^
                                 0x8000000000000000;
                          }
                          lVar26 = lVar26 + 1;
                        } while (iVar31 != (int)lVar26);
                      }
                      pdVar33 = (double *)((long)pdVar33 + 1);
                      lVar22 = lVar22 + local_2f0.kstride * 4;
                    } while (local_570 != (int)pdVar33);
                  }
                }
                else {
                  iVar32 = (int)local_4f0;
                  iVar34 = (int)local_4f8;
                  if ((int)local_438 == 0) {
                    if (iVar37 == 0x65) {
                      dVar46 = -(double)pdVar33 * local_200;
                      local_378.smallend.vect[0] = SUB84(dVar46,0);
                      local_378.smallend.vect[1] = (int)((ulong)dVar46 >> 0x20);
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0x3fe00000;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0x3ff80000;
                      local_378.btype.itype = 0;
                      uStack_35c = 0x40040000;
                      local_3b8.kstride = 0;
                      local_3b8.nstride = 0;
                      local_3b8.p = (double *)0x0;
                      local_3b8.jstride = 0;
                      local_378.smallend.vect._0_8_ = dVar46;
                      if (0 < iVar4) {
                        uVar40 = 0;
                        do {
                          uVar24 = 0;
                          dVar46 = dVar47;
                          dVar48 = dVar44;
                          do {
                            if (uVar40 != uVar24) {
                              dVar1 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                              dVar46 = dVar46 * (-0.5 - dVar1);
                              dVar48 = dVar48 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                                dVar1);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar43 != uVar24);
                          (&local_3b8.p)[uVar40] = (double *)(dVar46 / dVar48);
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar43);
                      }
                      uVar24 = local_560;
                      uVar40 = local_4d8;
                      if ((int)local_5a0 <= iVar5) {
                        lVar22 = (long)(int)local_568;
                        local_590 = (double *)local_3f8.kstride;
                        local_508 = (double *)(long)local_3f8.begin.z;
                        pdVar33 = local_458;
                        do {
                          if (iVar7 <= iVar32) {
                            lVar36 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                            lVar26 = local_5e0.nstride * uVar8;
                            local_548 = (double *)(long)local_258.begin.y;
                            lVar14 = local_528;
                            do {
                              if (0 < local_3f8.p
                                      [(lVar22 - local_3f8.begin.x) +
                                       ((long)pdVar33 - (long)local_508) * local_3f8.kstride +
                                       (lVar14 - local_3f8.begin.y) *
                                       CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride)]) {
                                dVar46 = 0.0;
                                if (1 < iVar4) {
                                  uVar40 = 1;
                                  do {
                                    dVar46 = dVar46 + local_5e0.p
                                                      [lVar36 + lVar26 + (lVar14 - local_5e0.begin.y
                                                                         ) * local_5e0.jstride +
                                                                         (long)(((int)local_568 -
                                                                                local_5e0.begin.x) +
                                                                               (int)uVar40)] *
                                                      (double)(&local_3b8.p)[uVar40];
                                    uVar40 = uVar40 + 1;
                                  } while (uVar43 != uVar40);
                                }
                                lVar38 = (lVar14 - local_5e0.begin.y) * local_5e0.jstride;
                                local_5e0.p[lVar36 + lVar26 + (lVar22 - local_5e0.begin.x) + lVar38]
                                     = dVar46;
                                if (bc_mode == Inhomogeneous) {
                                  local_5e0.p
                                  [lVar36 + lVar26 + (lVar22 - local_5e0.begin.x) + lVar38] =
                                       local_258.p
                                       [(lVar22 - local_258.begin.x) +
                                        ((long)pdVar33 - (long)local_258.begin.z) *
                                        local_258.kstride +
                                        local_258.nstride * uVar8 +
                                        (lVar14 - (long)local_548) * local_258.jstride] *
                                       (double)local_3b8.p + dVar46;
                                }
                              }
                              lVar14 = lVar14 + 1;
                            } while (local_54c != (int)lVar14);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          uVar40 = local_4d8;
                        } while (local_56c != (int)pdVar33);
                      }
                    }
                    else if (iVar37 == 0x66) {
                      if ((int)local_5a0 <= iVar5) {
                        piVar19 = (int *)((long)local_3f8.p +
                                         ((long)local_458 - (long)local_3f8.begin.z) *
                                         local_3f8.kstride * 4 +
                                         (local_528 - local_3f8.begin.y) *
                                         CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) *
                                         4 + (long)local_3f8.begin.x * -4 + local_468);
                        pdVar33 = local_458;
                        do {
                          if (iVar7 <= iVar32) {
                            lVar22 = local_5e0.nstride * local_578 +
                                     (local_528 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                     ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride *
                                     8 + (long)local_5e0.p;
                            piVar17 = piVar19;
                            iVar37 = local_410;
                            do {
                              if (0 < *piVar17) {
                                *(undefined8 *)(lVar22 + local_428 + (long)local_5e0.begin.x * -8) =
                                     *(undefined8 *)
                                      (lVar22 + (long)(local_418 - local_5e0.begin.x) * 8);
                              }
                              lVar22 = lVar22 + local_5e0.jstride * 8;
                              piVar17 = piVar17 + CONCAT44(local_3f8.jstride._4_4_,
                                                           (uint)local_3f8.jstride);
                              iVar37 = iVar37 + -1;
                            } while (iVar37 != 0);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          piVar19 = piVar19 + local_3f8.kstride;
                        } while (local_56c != (int)pdVar33);
                      }
                    }
                    else if ((iVar37 == 0x67) && ((int)local_5a0 <= iVar5)) {
                      piVar19 = (int *)((long)local_3f8.p +
                                       ((long)local_458 - (long)local_3f8.begin.z) *
                                       local_3f8.kstride * 4 +
                                       (local_528 - local_3f8.begin.y) *
                                       CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) * 4
                                       + (long)local_3f8.begin.x * -4 + local_468);
                      pdVar33 = local_458;
                      do {
                        if (iVar7 <= iVar32) {
                          lVar22 = local_5e0.nstride * local_578 +
                                   (local_528 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                   ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride * 8
                                   + (long)local_5e0.p;
                          piVar17 = piVar19;
                          iVar37 = local_410;
                          do {
                            if (0 < *piVar17) {
                              *(ulong *)(lVar22 + local_428 + (long)local_5e0.begin.x * -8) =
                                   *(ulong *)(lVar22 + (long)(local_418 - local_5e0.begin.x) * 8) ^
                                   0x8000000000000000;
                            }
                            lVar22 = lVar22 + local_5e0.jstride * 8;
                            piVar17 = piVar17 + CONCAT44(local_3f8.jstride._4_4_,
                                                         (uint)local_3f8.jstride);
                            iVar37 = iVar37 + -1;
                          } while (iVar37 != 0);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        piVar19 = piVar19 + local_3f8.kstride;
                      } while (local_56c != (int)pdVar33);
                    }
                    if (iVar35 == 0x65) {
                      dVar45 = -dVar45 * local_200;
                      local_378.smallend.vect[0] = SUB84(dVar45,0);
                      local_378.smallend.vect[1] = (int)((ulong)dVar45 >> 0x20);
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0x3fe00000;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0x3ff80000;
                      local_378.btype.itype = 0;
                      uStack_35c = 0x40040000;
                      local_3b8.kstride = 0;
                      local_3b8.nstride = 0;
                      local_3b8.p = (double *)0x0;
                      local_3b8.jstride = 0;
                      local_378.smallend.vect._0_8_ = dVar45;
                      if (0 < iVar4) {
                        uVar40 = 0;
                        do {
                          uVar24 = 0;
                          dVar45 = dVar47;
                          dVar46 = dVar44;
                          do {
                            if (uVar40 != uVar24) {
                              dVar48 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                              dVar45 = dVar45 * (-0.5 - dVar48);
                              dVar46 = dVar46 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                                dVar48);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar43 != uVar24);
                          (&local_3b8.p)[uVar40] = (double *)(dVar45 / dVar46);
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar43);
                      }
                      uVar24 = local_560;
                      uVar40 = local_4d8;
                      if ((int)local_588 <= iVar6) {
                        lVar22 = (long)local_600;
                        local_590 = (double *)local_2f0.kstride;
                        local_500 = (double *)(long)local_2f0.begin.z;
                        pdVar33 = local_460;
                        do {
                          if ((int)local_580 <= iVar34) {
                            lVar26 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                            lVar14 = local_5e0.nstride * uVar8;
                            local_548 = (double *)(long)local_298.begin.y;
                            pdVar42 = local_530;
                            do {
                              if (0 < local_2f0.p
                                      [(lVar22 - local_2f0.begin.x) +
                                       ((long)pdVar33 - (long)local_500) * local_2f0.kstride +
                                       ((long)pdVar42 - (long)local_2f0.begin.y) *
                                       CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride)]) {
                                dVar45 = 0.0;
                                if (1 < iVar4) {
                                  uVar40 = 1;
                                  iVar37 = local_214 - local_5e0.begin.x;
                                  do {
                                    dVar45 = dVar45 + local_5e0.p
                                                      [lVar26 + lVar14 + ((long)pdVar42 -
                                                                         (long)local_5e0.begin.y) *
                                                                         local_5e0.jstride +
                                                                         (long)iVar37] *
                                                      (double)(&local_3b8.p)[uVar40];
                                    uVar40 = uVar40 + 1;
                                    iVar37 = iVar37 + -1;
                                  } while (uVar43 != uVar40);
                                }
                                lVar36 = ((long)pdVar42 - (long)local_5e0.begin.y) *
                                         local_5e0.jstride;
                                local_5e0.p[lVar26 + lVar14 + (lVar22 - local_5e0.begin.x) + lVar36]
                                     = dVar45;
                                if (bc_mode == Inhomogeneous) {
                                  local_5e0.p
                                  [lVar26 + lVar14 + (lVar22 - local_5e0.begin.x) + lVar36] =
                                       local_298.p
                                       [(lVar22 - local_298.begin.x) +
                                        ((long)pdVar33 - (long)local_298.begin.z) *
                                        local_298.kstride +
                                        local_298.nstride * uVar8 +
                                        ((long)pdVar42 - (long)local_548) * local_298.jstride] *
                                       (double)local_3b8.p + dVar45;
                                }
                              }
                              pdVar42 = (double *)((long)pdVar42 + 1);
                            } while (local_550 != (int)pdVar42);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          uVar40 = local_4d8;
                        } while (local_570 != (int)pdVar33);
                      }
                    }
                    else if (iVar35 == 0x66) {
                      if ((int)local_588 <= iVar6) {
                        piVar19 = (int *)((long)local_2f0.p +
                                         ((long)local_460 - (long)local_2f0.begin.z) *
                                         local_2f0.kstride * 4 +
                                         ((long)local_530 - (long)local_2f0.begin.y) *
                                         CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) *
                                         4 + (long)local_2f0.begin.x * -4 + local_470);
                        pdVar33 = local_460;
                        do {
                          if ((int)local_580 <= iVar34) {
                            lVar22 = local_5e0.nstride * local_578 +
                                     ((long)local_530 - (long)local_5e0.begin.y) *
                                     local_5e0.jstride * 8 +
                                     ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride *
                                     8 + (long)local_5e0.p;
                            piVar17 = piVar19;
                            iVar37 = local_414;
                            do {
                              if (0 < *piVar17) {
                                *(undefined8 *)(lVar22 + local_430 + (long)local_5e0.begin.x * -8) =
                                     *(undefined8 *)
                                      (lVar22 + (long)(~local_5e0.begin.x + local_600) * 8);
                              }
                              lVar22 = lVar22 + local_5e0.jstride * 8;
                              piVar17 = piVar17 + CONCAT44(local_2f0.jstride._4_4_,
                                                           (uint)local_2f0.jstride);
                              iVar37 = iVar37 + -1;
                            } while (iVar37 != 0);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          piVar19 = piVar19 + local_2f0.kstride;
                        } while (local_570 != (int)pdVar33);
                      }
                    }
                    else if ((iVar35 == 0x67) && ((int)local_588 <= iVar6)) {
                      piVar19 = (int *)((long)local_2f0.p +
                                       ((long)local_460 - (long)local_2f0.begin.z) *
                                       local_2f0.kstride * 4 +
                                       ((long)local_530 - (long)local_2f0.begin.y) *
                                       CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) * 4
                                       + (long)local_2f0.begin.x * -4 + local_470);
                      pdVar33 = local_460;
                      do {
                        if ((int)local_580 <= iVar34) {
                          lVar22 = local_5e0.nstride * local_578 +
                                   ((long)local_530 - (long)local_5e0.begin.y) *
                                   local_5e0.jstride * 8 +
                                   ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride * 8
                                   + (long)local_5e0.p;
                          piVar17 = piVar19;
                          iVar37 = local_414;
                          do {
                            if (0 < *piVar17) {
                              *(ulong *)(lVar22 + local_430 + (long)local_5e0.begin.x * -8) =
                                   *(ulong *)(lVar22 + (long)(~local_5e0.begin.x + local_600) * 8) ^
                                   0x8000000000000000;
                            }
                            lVar22 = lVar22 + local_5e0.jstride * 8;
                            piVar17 = piVar17 + CONCAT44(local_2f0.jstride._4_4_,
                                                         (uint)local_2f0.jstride);
                            iVar37 = iVar37 + -1;
                          } while (iVar37 != 0);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        piVar19 = piVar19 + local_2f0.kstride;
                      } while (local_570 != (int)pdVar33);
                    }
                  }
                  else {
                    if (iVar37 == 0x65) {
                      dVar46 = -(double)pdVar33 * local_210;
                      local_378.smallend.vect[0] = SUB84(dVar46,0);
                      local_378.smallend.vect[1] = (int)((ulong)dVar46 >> 0x20);
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0x3fe00000;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0x3ff80000;
                      local_378.btype.itype = 0;
                      uStack_35c = 0x40040000;
                      local_3b8.kstride = 0;
                      local_3b8.nstride = 0;
                      local_3b8.p = (double *)0x0;
                      local_3b8.jstride = 0;
                      local_378.smallend.vect._0_8_ = dVar46;
                      if (0 < iVar4) {
                        uVar40 = 0;
                        do {
                          uVar24 = 0;
                          dVar46 = dVar47;
                          dVar48 = dVar44;
                          do {
                            if (uVar40 != uVar24) {
                              dVar1 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                              dVar46 = dVar46 * (-0.5 - dVar1);
                              dVar48 = dVar48 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                                dVar1);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar43 != uVar24);
                          (&local_3b8.p)[uVar40] = (double *)(dVar46 / dVar48);
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar43);
                      }
                      uVar24 = local_560;
                      uVar40 = local_4d8;
                      if (iVar7 <= iVar32) {
                        lVar14 = (long)(int)local_5a0;
                        local_590 = (double *)
                                    (local_3f8.p + (lVar14 - local_3f8.begin.z) * local_3f8.kstride)
                        ;
                        lVar22 = local_528;
                        do {
                          if ((int)local_568 <= iVar25) {
                            local_548 = local_5e0.p +
                                        (lVar22 - local_5e0.begin.y) * local_5e0.jstride +
                                        local_5e0.nstride * uVar8;
                            lVar36 = (lVar14 - local_5e0.begin.z) * local_5e0.kstride;
                            lVar26 = local_2a8;
                            do {
                              if (0 < *(int *)((long)local_590 +
                                              (lVar26 - local_3f8.begin.x) * 4 +
                                              (lVar22 - local_3f8.begin.y) *
                                              CONCAT44(local_3f8.jstride._4_4_,
                                                       (uint)local_3f8.jstride) * 4)) {
                                dVar46 = 0.0;
                                if (1 < iVar4) {
                                  uVar40 = 1;
                                  do {
                                    dVar46 = dVar46 + local_548[(lVar26 - local_5e0.begin.x) +
                                                                (((int)local_5a0 - local_5e0.begin.z
                                                                 ) + (int)uVar40) *
                                                                local_5e0.kstride] *
                                                      (double)(&local_3b8.p)[uVar40];
                                    uVar40 = uVar40 + 1;
                                  } while (uVar43 != uVar40);
                                }
                                lVar38 = lVar26 - local_5e0.begin.x;
                                local_548[lVar36 + lVar38] = dVar46;
                                if (bc_mode == Inhomogeneous) {
                                  local_548[lVar36 + lVar38] =
                                       local_258.p
                                       [(lVar22 - local_258.begin.y) * local_258.jstride +
                                        (lVar14 - local_258.begin.z) * local_258.kstride +
                                        local_258.nstride * uVar8 + (lVar26 - local_258.begin.x)] *
                                       (double)local_3b8.p + dVar46;
                                }
                              }
                              lVar26 = lVar26 + 1;
                            } while (iVar39 != (int)lVar26);
                          }
                          lVar22 = lVar22 + 1;
                          uVar40 = local_4d8;
                        } while (local_54c != (int)lVar22);
                      }
                    }
                    else if (iVar37 == 0x66) {
                      if (iVar7 <= iVar32) {
                        lVar14 = CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) * 4;
                        lVar26 = (long)local_3f8.p +
                                 (local_528 - local_3f8.begin.y) * lVar14 +
                                 ((int)local_5a0 - local_3f8.begin.z) * local_3f8.kstride * 4 +
                                 (long)local_3f8.begin.x * -4 + local_468;
                        lVar22 = local_528;
                        do {
                          if ((int)local_568 <= iVar25) {
                            lVar36 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                            lVar38 = 0;
                            do {
                              if (0 < *(int *)(lVar26 + lVar38 * 4)) {
                                *(undefined8 *)
                                 ((long)local_5e0.p +
                                 lVar38 * 8 +
                                 (long)((int)local_5a0 - local_5e0.begin.z) * local_5e0.kstride * 8
                                 + lVar36 * 8 + local_5e0.nstride * local_578 +
                                 (long)local_5e0.begin.x * -8 + local_428) =
                                     *(undefined8 *)
                                      ((long)local_5e0.p +
                                      lVar38 * 8 +
                                      local_5e0.kstride * 8 * (long)(local_558 - local_5e0.begin.z)
                                      + lVar36 * 8 + local_5e0.nstride * local_578 +
                                      (long)local_5e0.begin.x * -8 + local_428);
                              }
                              lVar38 = lVar38 + 1;
                            } while (iVar23 != (int)lVar38);
                          }
                          lVar22 = lVar22 + 1;
                          lVar26 = lVar26 + lVar14;
                        } while (local_54c != (int)lVar22);
                      }
                    }
                    else if ((iVar37 == 0x67) && (iVar7 <= iVar32)) {
                      lVar14 = CONCAT44(local_3f8.jstride._4_4_,(uint)local_3f8.jstride) * 4;
                      lVar26 = (long)local_3f8.p +
                               (local_528 - local_3f8.begin.y) * lVar14 +
                               ((int)local_5a0 - local_3f8.begin.z) * local_3f8.kstride * 4 +
                               (long)local_3f8.begin.x * -4 + local_468;
                      lVar22 = local_528;
                      do {
                        if ((int)local_568 <= iVar25) {
                          lVar36 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                          lVar38 = 0;
                          do {
                            if (0 < *(int *)(lVar26 + lVar38 * 4)) {
                              *(ulong *)((long)local_5e0.p +
                                        lVar38 * 8 +
                                        (long)((int)local_5a0 - local_5e0.begin.z) *
                                        local_5e0.kstride * 8 + lVar36 * 8 +
                                        local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8
                                        + local_428) =
                                   *(ulong *)((long)local_5e0.p +
                                             lVar38 * 8 +
                                             local_5e0.kstride * 8 *
                                             (long)(local_558 - local_5e0.begin.z) + lVar36 * 8 +
                                             local_5e0.nstride * local_578 +
                                             (long)local_5e0.begin.x * -8 + local_428) ^
                                   0x8000000000000000;
                            }
                            lVar38 = lVar38 + 1;
                          } while (iVar23 != (int)lVar38);
                        }
                        lVar22 = lVar22 + 1;
                        lVar26 = lVar26 + lVar14;
                      } while (local_54c != (int)lVar22);
                    }
                    if (iVar35 == 0x65) {
                      dVar45 = -dVar45 * local_210;
                      local_378.smallend.vect[0] = SUB84(dVar45,0);
                      local_378.smallend.vect[1] = (int)((ulong)dVar45 >> 0x20);
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0x3fe00000;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0x3ff80000;
                      local_378.btype.itype = 0;
                      uStack_35c = 0x40040000;
                      local_3b8.kstride = 0;
                      local_3b8.nstride = 0;
                      local_3b8.p = (double *)0x0;
                      local_3b8.jstride = 0;
                      local_378.smallend.vect._0_8_ = dVar45;
                      if (0 < iVar4) {
                        uVar40 = 0;
                        do {
                          uVar24 = 0;
                          dVar45 = dVar47;
                          dVar46 = dVar44;
                          do {
                            if (uVar40 != uVar24) {
                              dVar48 = *(double *)(local_378.smallend.vect + uVar24 * 2);
                              dVar45 = dVar45 * (-0.5 - dVar48);
                              dVar46 = dVar46 * (*(double *)(local_378.smallend.vect + uVar40 * 2) -
                                                dVar48);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar43 != uVar24);
                          (&local_3b8.p)[uVar40] = (double *)(dVar45 / dVar46);
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar43);
                      }
                      uVar24 = local_560;
                      uVar40 = local_4d8;
                      if ((int)local_580 <= iVar34) {
                        lVar22 = (long)(int)local_588;
                        local_590 = (double *)
                                    (local_2f0.p + (lVar22 - local_2f0.begin.z) * local_2f0.kstride)
                        ;
                        local_548 = local_530;
                        do {
                          if (local_600 <= iVar13) {
                            lVar38 = ((long)local_548 - (long)local_5e0.begin.y) * local_5e0.jstride
                            ;
                            lVar26 = local_5e0.nstride * uVar8;
                            lVar36 = (lVar22 - local_5e0.begin.z) * local_5e0.kstride;
                            lVar14 = local_2b0;
                            do {
                              if (0 < *(int *)((long)local_590 +
                                              (lVar14 - local_2f0.begin.x) * 4 +
                                              ((long)local_548 - (long)local_2f0.begin.y) *
                                              CONCAT44(local_2f0.jstride._4_4_,
                                                       (uint)local_2f0.jstride) * 4)) {
                                dVar45 = 0.0;
                                if (1 < iVar4) {
                                  uVar40 = 1;
                                  iVar37 = local_4b8 - local_5e0.begin.z;
                                  do {
                                    dVar45 = dVar45 + local_5e0.p
                                                      [lVar38 + lVar26 + (lVar14 - local_5e0.begin.x
                                                                         ) + local_5e0.kstride *
                                                                             iVar37] *
                                                      (double)(&local_3b8.p)[uVar40];
                                    uVar40 = uVar40 + 1;
                                    iVar37 = iVar37 + -1;
                                  } while (uVar43 != uVar40);
                                }
                                lVar41 = lVar14 - local_5e0.begin.x;
                                local_5e0.p[lVar38 + lVar26 + lVar36 + lVar41] = dVar45;
                                if (bc_mode == Inhomogeneous) {
                                  local_5e0.p[lVar38 + lVar26 + lVar36 + lVar41] =
                                       local_298.p
                                       [((long)local_548 - (long)local_298.begin.y) *
                                        local_298.jstride +
                                        (lVar22 - local_298.begin.z) * local_298.kstride +
                                        local_298.nstride * uVar8 + (lVar14 - local_298.begin.x)] *
                                       (double)local_3b8.p + dVar45;
                                }
                              }
                              lVar14 = lVar14 + 1;
                            } while (local_40c != (int)lVar14);
                          }
                          local_548 = (double *)((long)local_548 + 1);
                          uVar40 = local_4d8;
                        } while (local_550 != (int)local_548);
                      }
                    }
                    else if (iVar35 == 0x66) {
                      if ((int)local_580 <= iVar34) {
                        lVar22 = CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) * 4;
                        lVar14 = (long)local_2f0.p +
                                 ((long)local_530 - (long)local_2f0.begin.y) * lVar22 +
                                 ((int)local_588 - local_2f0.begin.z) * local_2f0.kstride * 4 +
                                 (long)local_2f0.begin.x * -4 + local_470;
                        pdVar33 = local_530;
                        do {
                          if (local_600 <= iVar13) {
                            lVar26 = ((long)pdVar33 - (long)local_5e0.begin.y) * local_5e0.jstride;
                            lVar36 = 0;
                            do {
                              if (0 < *(int *)(lVar14 + lVar36 * 4)) {
                                *(undefined8 *)
                                 ((long)local_5e0.p +
                                 lVar36 * 8 +
                                 (long)((int)local_588 - local_5e0.begin.z) * local_5e0.kstride * 8
                                 + lVar26 * 8 + local_5e0.nstride * local_578 +
                                 (long)local_5e0.begin.x * -8 + local_430) =
                                     *(undefined8 *)
                                      ((long)local_5e0.p +
                                      lVar36 * 8 +
                                      local_5e0.kstride * 8 *
                                      (long)(~local_5e0.begin.z + (int)local_588) + lVar26 * 8 +
                                      local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8 +
                                      local_430);
                              }
                              lVar36 = lVar36 + 1;
                            } while (iVar31 != (int)lVar36);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          lVar14 = lVar14 + lVar22;
                        } while (local_550 != (int)pdVar33);
                      }
                    }
                    else if ((iVar35 == 0x67) && ((int)local_580 <= iVar34)) {
                      lVar22 = CONCAT44(local_2f0.jstride._4_4_,(uint)local_2f0.jstride) * 4;
                      lVar14 = (long)local_2f0.p +
                               ((long)local_530 - (long)local_2f0.begin.y) * lVar22 +
                               ((int)local_588 - local_2f0.begin.z) * local_2f0.kstride * 4 +
                               (long)local_2f0.begin.x * -4 + local_470;
                      pdVar33 = local_530;
                      do {
                        if (local_600 <= iVar13) {
                          lVar26 = ((long)pdVar33 - (long)local_5e0.begin.y) * local_5e0.jstride;
                          lVar36 = 0;
                          do {
                            if (0 < *(int *)(lVar14 + lVar36 * 4)) {
                              *(ulong *)((long)local_5e0.p +
                                        lVar36 * 8 +
                                        (long)((int)local_588 - local_5e0.begin.z) *
                                        local_5e0.kstride * 8 + lVar26 * 8 +
                                        local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8
                                        + local_430) =
                                   *(ulong *)((long)local_5e0.p +
                                             lVar36 * 8 +
                                             local_5e0.kstride * 8 *
                                             (long)(~local_5e0.begin.z + (int)local_588) +
                                             lVar26 * 8 + local_5e0.nstride * local_578 +
                                             (long)local_5e0.begin.x * -8 + local_430) ^
                                   0x8000000000000000;
                            }
                            lVar36 = lVar36 + 1;
                          } while (iVar31 != (int)lVar36);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar14 = lVar14 + lVar22;
                      } while (local_550 != (int)pdVar33);
                    }
                  }
                }
              }
              else {
                uStack_540 = 0;
                local_1d8 = dVar45;
                uStack_1d0 = 0;
                local_548 = pdVar33;
                MultiCutFab::const_array(&local_3b8,(MultiCutFab *)local_a8[local_438],&local_108);
                FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                          (&local_4b0,local_128,&local_108);
                iVar5 = (int)local_598;
                iVar35 = (int)local_518;
                iVar7 = (int)local_4e0;
                iVar6 = (int)local_520;
                iVar13 = (int)local_4e8;
                iVar25 = (int)local_400;
                if ((int)local_438 == 1) {
                  if (iVar37 == 0x65) {
                    local_310[0] = -(double)local_548 * local_208;
                    local_310[1] = 0.5;
                    local_310[2] = 1.5;
                    local_310[3] = 2.5;
                    local_328 = 0;
                    uStack_320 = 0;
                    local_338 = 0;
                    uStack_330 = 0;
                    local_348 = 0;
                    uStack_340 = 0;
                    local_358 = 0;
                    uStack_350 = 0;
                    local_378.bigend.vect[1] = 0;
                    local_378.bigend.vect[2] = 0;
                    local_378.btype.itype = 0;
                    uStack_35c = 0;
                    local_378.smallend.vect[0] = 0;
                    local_378.smallend.vect[1] = 0;
                    local_378.smallend.vect[2] = 0;
                    local_378.bigend.vect[0] = 0;
                    if (1 < (int)local_408) {
                      lVar22 = 2;
                      uVar8 = 0;
                      do {
                        lVar14 = 0;
                        do {
                          lVar26 = 0;
                          dVar45 = 1.0;
                          dVar47 = 1.0;
                          do {
                            if (lVar14 != lVar26) {
                              dVar45 = dVar45 * (-0.5 - local_310[lVar26]);
                              dVar47 = dVar47 * (local_310[lVar14] - local_310[lVar26]);
                            }
                            lVar26 = lVar26 + 1;
                          } while (lVar22 != lVar26);
                          *(double *)((long)&local_378 + (uVar8 * 4 + lVar14) * 8) = dVar45 / dVar47
                          ;
                          lVar14 = lVar14 + 1;
                        } while (lVar14 != lVar22);
                        uVar8 = uVar8 + 1;
                        lVar22 = lVar22 + 1;
                      } while (uVar8 != uVar40);
                    }
                    uVar40 = local_4d8;
                    if ((int)local_5a0 <= iVar35) {
                      local_448 = (double *)(long)local_4b0.begin.z;
                      local_4d0 = (double *)local_4b0.kstride;
                      local_450 = (double *)
                                  ((long)local_4b0.p +
                                  (iVar5 - local_4b0.begin.y) * local_4b0.jstride * 4);
                      local_440 = (double *)
                                  ((long)local_4b0.p +
                                  (local_554 - local_4b0.begin.y) * local_4b0.jstride * 4);
                      pdVar33 = local_458;
                      do {
                        if ((int)local_568 <= iVar7) {
                          lVar14 = ((long)pdVar33 - (long)local_448) * local_4b0.kstride;
                          local_548 = (double *)((long)local_440 + lVar14 * 4);
                          local_590 = local_3b8.p +
                                      ((long)pdVar33 - (long)local_3b8.begin.z) * local_3b8.kstride;
                          lVar26 = (long)local_5e0.begin.x;
                          local_4c8 = local_5e0.p +
                                      ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride
                                      + local_5e0.nstride * local_4c0;
                          lVar36 = ((long)iVar5 - (long)local_5e0.begin.y) * local_5e0.jstride;
                          local_508 = (double *)(long)local_258.begin.x;
                          local_510 = local_258.p +
                                      ((long)iVar5 - (long)local_258.begin.y) * local_258.jstride +
                                      ((long)pdVar33 - (long)local_258.begin.z) * local_258.kstride
                                      + local_258.nstride * local_4c0;
                          lVar22 = local_2a8;
                          do {
                            if ((*(int *)((long)local_450 +
                                         (lVar22 - local_4b0.begin.x) * 4 + lVar14 * 4) == 0) &&
                               (*(int *)((long)local_548 + (lVar22 - local_4b0.begin.x) * 4) == 1))
                            {
                              if (iVar4 < 2) {
                                uVar15 = 1;
                                bVar21 = false;
                              }
                              else {
                                uVar15 = 1;
                                lVar38 = 0;
                                bVar21 = false;
                                do {
                                  dVar45 = local_590[(lVar22 - local_3b8.begin.x) +
                                                     ((local_554 - local_3b8.begin.y) + (int)lVar38)
                                                     * local_3b8.jstride];
                                  uVar15 = (0.0 < dVar45) + uVar15;
                                  bVar20 = bVar21;
                                  if (dVar45 < 1.0) {
                                    bVar20 = true;
                                  }
                                  uVar24 = local_560;
                                } while ((0.0 < dVar45) &&
                                        (bVar2 = lVar38 < local_2a0, lVar38 = lVar38 + 1,
                                        bVar21 = bVar20, bVar2));
                              }
                              uVar40 = 2;
                              if ((int)uVar15 < 2) {
                                uVar40 = (ulong)uVar15;
                              }
                              if (!bVar21) {
                                uVar40 = (ulong)uVar15;
                              }
                              iVar37 = (int)uVar40;
                              if (iVar37 == 1) {
                                if (bc_mode == Inhomogeneous) {
                                  local_4c8[lVar36 + (lVar22 - lVar26)] =
                                       local_510[lVar22 - (long)local_508];
                                }
                                else {
                                  local_4c8[lVar36 + (lVar22 - lVar26)] = 0.0;
                                }
                              }
                              else {
                                dVar45 = 0.0;
                                if (1 < iVar37) {
                                  uVar24 = 1;
                                  do {
                                    dVar45 = dVar45 + local_4c8[(lVar22 - lVar26) +
                                                                ((iVar5 - local_5e0.begin.y) +
                                                                (int)uVar24) * local_5e0.jstride] *
                                                      *(double *)
                                                       (local_378.smallend.vect +
                                                       ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                    uVar24 = uVar24 + 1;
                                  } while (uVar40 != uVar24);
                                }
                                local_4c8[lVar36 + (lVar22 - lVar26)] = dVar45;
                                uVar24 = local_560;
                                if (bc_mode == Inhomogeneous) {
                                  local_4c8[lVar36 + (lVar22 - lVar26)] =
                                       local_510[lVar22 - (long)local_508] *
                                       *(double *)
                                        (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                       dVar45;
                                }
                              }
                            }
                            lVar22 = lVar22 + 1;
                          } while (iVar39 != (int)lVar22);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        uVar40 = local_4d8;
                      } while (local_56c != (int)pdVar33);
                    }
                  }
                  else if (iVar37 == 0x66) {
                    if ((int)local_5a0 <= iVar35) {
                      lVar26 = local_4b0.kstride * 4;
                      lVar14 = ((long)local_458 - (long)local_4b0.begin.z) * lVar26;
                      lVar22 = (long)local_4b0.p +
                               (long)(iVar5 - local_4b0.begin.y) * local_4b0.jstride * 4 + lVar14 +
                               (long)local_4b0.begin.x * -4 + local_468;
                      lVar14 = (long)local_4b0.p +
                               local_4b0.jstride * 4 * (long)(local_554 - local_4b0.begin.y) +
                               lVar14 + (long)local_4b0.begin.x * -4 + local_468;
                      pdVar33 = local_458;
                      do {
                        if ((int)local_568 <= iVar7) {
                          lVar38 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                          lVar36 = 0;
                          do {
                            if ((*(int *)(lVar22 + lVar36 * 4) == 0) &&
                               (*(int *)(lVar14 + lVar36 * 4) == 1)) {
                              *(undefined8 *)
                               ((long)local_5e0.p +
                               lVar36 * 8 +
                               local_5e0.jstride * 8 * (long)(iVar5 - local_5e0.begin.y) +
                               lVar38 * 8 + local_5e0.nstride * local_578 +
                               (long)local_5e0.begin.x * -8 + local_428) =
                                   *(undefined8 *)
                                    ((long)local_5e0.p +
                                    lVar36 * 8 +
                                    (long)(local_554 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                    lVar38 * 8 + local_5e0.nstride * local_578 +
                                    (long)local_5e0.begin.x * -8 + local_428);
                            }
                            lVar36 = lVar36 + 1;
                          } while (iVar23 != (int)lVar36);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar22 = lVar22 + lVar26;
                        lVar14 = lVar14 + lVar26;
                      } while (local_56c != (int)pdVar33);
                    }
                  }
                  else if ((iVar37 == 0x67) && ((int)local_5a0 <= iVar35)) {
                    lVar26 = local_4b0.kstride * 4;
                    lVar14 = ((long)local_458 - (long)local_4b0.begin.z) * lVar26;
                    lVar22 = (long)local_4b0.p +
                             (long)(iVar5 - local_4b0.begin.y) * local_4b0.jstride * 4 + lVar14 +
                             (long)local_4b0.begin.x * -4 + local_468;
                    lVar14 = (long)local_4b0.p +
                             local_4b0.jstride * 4 * (long)(local_554 - local_4b0.begin.y) + lVar14
                             + (long)local_4b0.begin.x * -4 + local_468;
                    pdVar33 = local_458;
                    do {
                      if ((int)local_568 <= iVar7) {
                        lVar38 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                        lVar36 = 0;
                        do {
                          if ((*(int *)(lVar22 + lVar36 * 4) == 0) &&
                             (*(int *)(lVar14 + lVar36 * 4) == 1)) {
                            *(ulong *)((long)local_5e0.p +
                                      lVar36 * 8 +
                                      local_5e0.jstride * 8 * (long)(iVar5 - local_5e0.begin.y) +
                                      lVar38 * 8 + local_5e0.nstride * local_578 +
                                      (long)local_5e0.begin.x * -8 + local_428) =
                                 *(ulong *)((long)local_5e0.p +
                                           lVar36 * 8 +
                                           (long)(local_554 - local_5e0.begin.y) *
                                           local_5e0.jstride * 8 + lVar38 * 8 +
                                           local_5e0.nstride * local_578 +
                                           (long)local_5e0.begin.x * -8 + local_428) ^
                                 0x8000000000000000;
                          }
                          lVar36 = lVar36 + 1;
                        } while (iVar23 != (int)lVar36);
                      }
                      pdVar33 = (double *)((long)pdVar33 + 1);
                      lVar22 = lVar22 + lVar26;
                      lVar14 = lVar14 + lVar26;
                    } while (local_56c != (int)pdVar33);
                  }
                  if ((int)local_500 == 0x65) {
                    local_310[0] = -local_1d8 * local_208;
                    local_310[1] = 0.5;
                    local_310[2] = 1.5;
                    local_310[3] = 2.5;
                    local_328 = 0;
                    uStack_320 = 0;
                    local_338 = 0;
                    uStack_330 = 0;
                    local_348 = 0;
                    uStack_340 = 0;
                    local_358 = 0;
                    uStack_350 = 0;
                    local_378.bigend.vect[1] = 0;
                    local_378.bigend.vect[2] = 0;
                    local_378.btype.itype = 0;
                    uStack_35c = 0;
                    local_378.smallend.vect[0] = 0;
                    local_378.smallend.vect[1] = 0;
                    local_378.smallend.vect[2] = 0;
                    local_378.bigend.vect[0] = 0;
                    if (1 < (int)local_408) {
                      lVar22 = 2;
                      uVar24 = 0;
                      do {
                        lVar14 = 0;
                        do {
                          lVar26 = 0;
                          dVar45 = 1.0;
                          dVar47 = 1.0;
                          do {
                            if (lVar14 != lVar26) {
                              dVar45 = dVar45 * (-0.5 - local_310[lVar26]);
                              dVar47 = dVar47 * (local_310[lVar14] - local_310[lVar26]);
                            }
                            lVar26 = lVar26 + 1;
                          } while (lVar22 != lVar26);
                          *(double *)((long)&local_378 + (uVar24 * 4 + lVar14) * 8) =
                               dVar45 / dVar47;
                          lVar14 = lVar14 + 1;
                        } while (lVar14 != lVar22);
                        uVar24 = uVar24 + 1;
                        lVar22 = lVar22 + 1;
                      } while (uVar24 != uVar40);
                    }
                    uVar24 = local_560;
                    uVar40 = local_4d8;
                    if ((int)local_588 <= iVar6) {
                      local_448 = (double *)(long)local_4b0.begin.z;
                      local_4d0 = (double *)local_4b0.kstride;
                      local_450 = (double *)
                                  ((long)local_4b0.p +
                                  ((int)local_580 - local_4b0.begin.y) * local_4b0.jstride * 4);
                      local_440 = (double *)
                                  ((long)local_4b0.p +
                                  (~local_4b0.begin.y + (int)local_580) * local_4b0.jstride * 4);
                      pdVar33 = local_460;
                      do {
                        if (local_600 <= iVar13) {
                          lVar14 = ((long)pdVar33 - (long)local_448) * local_4b0.kstride;
                          lVar26 = (long)local_5e0.begin.x;
                          local_510 = local_5e0.p +
                                      ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride
                                      + local_5e0.nstride * local_4c0;
                          local_548 = local_510 +
                                      ((long)(int)local_580 - (long)local_5e0.begin.y) *
                                      local_5e0.jstride;
                          local_590 = (double *)(long)local_298.begin.x;
                          local_500 = (double *)
                                      CONCAT44(local_500._4_4_,(int)local_580 - local_3b8.begin.y);
                          local_508 = local_298.p +
                                      ((long)(int)local_580 - (long)local_298.begin.y) *
                                      local_298.jstride +
                                      ((long)pdVar33 - (long)local_298.begin.z) * local_298.kstride
                                      + local_298.nstride * local_4c0;
                          local_4c8 = (double *)
                                      CONCAT44(local_4c8._4_4_,local_4b4 - local_5e0.begin.y);
                          lVar22 = local_2b0;
                          do {
                            if ((*(int *)((long)local_450 +
                                         (lVar22 - local_4b0.begin.x) * 4 + lVar14 * 4) == 0) &&
                               (*(int *)((long)local_440 +
                                        (lVar22 - local_4b0.begin.x) * 4 + lVar14 * 4) == 1)) {
                              if (iVar4 < 2) {
                                uVar15 = 1;
                                bVar21 = false;
                              }
                              else {
                                uVar15 = 1;
                                lVar36 = 0;
                                iVar37 = (int)local_580 - local_3b8.begin.y;
                                bVar21 = false;
                                do {
                                  dVar45 = local_3b8.p
                                           [((long)pdVar33 - (long)local_3b8.begin.z) *
                                            local_3b8.kstride +
                                            (lVar22 - local_3b8.begin.x) +
                                            iVar37 * local_3b8.jstride];
                                  uVar15 = (0.0 < dVar45) + uVar15;
                                  bVar20 = bVar21;
                                  if (dVar45 < 1.0) {
                                    bVar20 = true;
                                  }
                                  if (dVar45 <= 0.0) break;
                                  iVar37 = iVar37 + -1;
                                  bVar2 = lVar36 < local_2a0;
                                  lVar36 = lVar36 + 1;
                                  bVar21 = bVar20;
                                } while (bVar2);
                              }
                              uVar40 = 2;
                              if ((int)uVar15 < 2) {
                                uVar40 = (ulong)uVar15;
                              }
                              if (!bVar21) {
                                uVar40 = (ulong)uVar15;
                              }
                              iVar37 = (int)uVar40;
                              if (iVar37 == 1) {
                                if (bc_mode == Inhomogeneous) {
                                  local_548[lVar22 - lVar26] = local_508[lVar22 - (long)local_590];
                                }
                                else {
                                  local_548[lVar22 - lVar26] = 0.0;
                                }
                              }
                              else {
                                dVar45 = 0.0;
                                if (1 < iVar37) {
                                  uVar24 = 1;
                                  iVar35 = local_4b4 - local_5e0.begin.y;
                                  do {
                                    dVar45 = dVar45 + local_510[(lVar22 - lVar26) +
                                                                local_5e0.jstride * iVar35] *
                                                      *(double *)
                                                       (local_378.smallend.vect +
                                                       ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                    uVar24 = uVar24 + 1;
                                    iVar35 = iVar35 + -1;
                                  } while (uVar40 != uVar24);
                                }
                                local_548[lVar22 - lVar26] = dVar45;
                                if (bc_mode == Inhomogeneous) {
                                  local_548[lVar22 - lVar26] =
                                       local_508[lVar22 - (long)local_590] *
                                       *(double *)
                                        (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                       dVar45;
                                }
                              }
                            }
                            lVar22 = lVar22 + 1;
                          } while (local_40c != (int)lVar22);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        uVar24 = local_560;
                        uVar40 = local_4d8;
                      } while (local_570 != (int)pdVar33);
                    }
                  }
                  else if ((int)local_500 == 0x66) {
                    if ((int)local_588 <= iVar6) {
                      lVar26 = local_4b0.kstride * 4;
                      lVar14 = ((long)local_460 - (long)local_4b0.begin.z) * lVar26;
                      lVar22 = (long)local_4b0.p +
                               (long)((int)local_580 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                               lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar14 = (long)local_4b0.p +
                               local_4b0.jstride * 4 * (long)(local_4b4 - local_4b0.begin.y) +
                               lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                      pdVar33 = local_460;
                      do {
                        if (local_600 <= iVar13) {
                          lVar38 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                          lVar36 = 0;
                          do {
                            if ((*(int *)(lVar22 + lVar36 * 4) == 0) &&
                               (*(int *)(lVar14 + lVar36 * 4) == 1)) {
                              *(undefined8 *)
                               ((long)local_5e0.p +
                               lVar36 * 8 +
                               local_5e0.jstride * 8 * (long)((int)local_580 - local_5e0.begin.y) +
                               lVar38 * 8 + local_5e0.nstride * local_578 +
                               (long)local_5e0.begin.x * -8 + local_430) =
                                   *(undefined8 *)
                                    ((long)local_5e0.p +
                                    lVar36 * 8 +
                                    (long)(local_4b4 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                    lVar38 * 8 + local_5e0.nstride * local_578 +
                                    (long)local_5e0.begin.x * -8 + local_430);
                            }
                            lVar36 = lVar36 + 1;
                          } while (iVar25 != (int)lVar36);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar22 = lVar22 + lVar26;
                        lVar14 = lVar14 + lVar26;
                      } while (local_570 != (int)pdVar33);
                    }
                  }
                  else if (((int)local_500 == 0x67) && ((int)local_588 <= iVar6)) {
                    lVar26 = local_4b0.kstride * 4;
                    lVar14 = ((long)local_460 - (long)local_4b0.begin.z) * lVar26;
                    lVar22 = (long)local_4b0.p +
                             (long)((int)local_580 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                             lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                    lVar14 = (long)local_4b0.p +
                             local_4b0.jstride * 4 * (long)(local_4b4 - local_4b0.begin.y) + lVar14
                             + (long)local_4b0.begin.x * -4 + local_470;
                    pdVar33 = local_460;
                    do {
                      if (local_600 <= iVar13) {
                        lVar38 = ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride;
                        lVar36 = 0;
                        do {
                          if ((*(int *)(lVar22 + lVar36 * 4) == 0) &&
                             (*(int *)(lVar14 + lVar36 * 4) == 1)) {
                            *(ulong *)((long)local_5e0.p +
                                      lVar36 * 8 +
                                      local_5e0.jstride * 8 *
                                      (long)((int)local_580 - local_5e0.begin.y) + lVar38 * 8 +
                                      local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8 +
                                      local_430) =
                                 *(ulong *)((long)local_5e0.p +
                                           lVar36 * 8 +
                                           (long)(local_4b4 - local_5e0.begin.y) *
                                           local_5e0.jstride * 8 + lVar38 * 8 +
                                           local_5e0.nstride * local_578 +
                                           (long)local_5e0.begin.x * -8 + local_430) ^
                                 0x8000000000000000;
                          }
                          lVar36 = lVar36 + 1;
                        } while (iVar25 != (int)lVar36);
                      }
                      pdVar33 = (double *)((long)pdVar33 + 1);
                      lVar22 = lVar22 + lVar26;
                      lVar14 = lVar14 + lVar26;
                    } while (local_570 != (int)pdVar33);
                  }
                }
                else {
                  dVar45 = 1.0;
                  dVar47 = 1.0;
                  iVar34 = (int)local_4f0;
                  iVar31 = (int)local_4f8;
                  if ((int)local_438 == 0) {
                    if (iVar37 == 0x65) {
                      local_310[0] = -(double)local_548 * local_200;
                      local_310[1] = 0.5;
                      local_310[2] = 1.5;
                      local_310[3] = 2.5;
                      local_328 = 0;
                      uStack_320 = 0;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0;
                      local_378.btype.itype = 0;
                      uStack_35c = 0;
                      local_378.smallend.vect[0] = 0;
                      local_378.smallend.vect[1] = 0;
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0;
                      if (1 < (int)local_408) {
                        lVar22 = 2;
                        uVar24 = 0;
                        do {
                          lVar14 = 0;
                          do {
                            lVar26 = 0;
                            dVar44 = dVar45;
                            dVar46 = dVar47;
                            do {
                              if (lVar14 != lVar26) {
                                dVar44 = dVar44 * (-0.5 - local_310[lVar26]);
                                dVar46 = dVar46 * (local_310[lVar14] - local_310[lVar26]);
                              }
                              lVar26 = lVar26 + 1;
                            } while (lVar22 != lVar26);
                            *(double *)((long)&local_378 + (uVar24 * 4 + lVar14) * 8) =
                                 dVar44 / dVar46;
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != lVar22);
                          uVar24 = uVar24 + 1;
                          lVar22 = lVar22 + 1;
                        } while (uVar24 != uVar40);
                      }
                      uVar24 = local_560;
                      uVar40 = local_4d8;
                      if ((int)local_5a0 <= iVar35) {
                        local_1e0 = (double *)(long)local_4b0.begin.z;
                        local_130 = (double *)local_4b0.kstride;
                        local_548 = (double *)(long)(local_418 - local_4b0.begin.x);
                        local_590 = local_458;
                        do {
                          if (iVar5 <= iVar34) {
                            lVar36 = ((long)local_590 - (long)local_4b0.begin.z) * local_4b0.kstride
                            ;
                            local_508 = (double *)(long)local_3b8.begin.y;
                            local_4c8 = (double *)local_3b8.jstride;
                            local_510 = local_3b8.p +
                                        ((long)local_590 - (long)local_3b8.begin.z) *
                                        local_3b8.kstride;
                            lVar14 = (long)local_5e0.begin.y;
                            local_440 = local_5e0.p +
                                        ((long)local_590 - (long)local_5e0.begin.z) *
                                        local_5e0.kstride + local_5e0.nstride * local_4c0;
                            lVar26 = (long)(int)local_568 - (long)local_5e0.begin.x;
                            local_448 = (double *)(long)local_258.begin.y;
                            local_4d0 = (double *)local_258.jstride;
                            local_450 = local_258.p +
                                        ((long)(int)local_568 - (long)local_258.begin.x) +
                                        ((long)local_590 - (long)local_258.begin.z) *
                                        local_258.kstride + local_258.nstride * local_4c0;
                            lVar22 = local_528;
                            do {
                              lVar38 = (lVar22 - local_4b0.begin.y) * local_4b0.jstride;
                              if ((*(int *)((long)local_4b0.p +
                                           lVar36 * 4 +
                                           (long)((int)local_568 - local_4b0.begin.x) * 4 +
                                           lVar38 * 4) == 0) &&
                                 (*(int *)((long)local_4b0.p +
                                          lVar36 * 4 + (long)local_548 * 4 + lVar38 * 4) == 1)) {
                                if (iVar4 < 2) {
                                  uVar15 = 1;
                                  bVar21 = false;
                                }
                                else {
                                  uVar15 = 1;
                                  lVar38 = 0;
                                  bVar21 = false;
                                  do {
                                    dVar44 = local_510[(lVar22 - (long)local_508) *
                                                       local_3b8.jstride +
                                                       (long)((local_418 - local_3b8.begin.x) +
                                                             (int)lVar38)];
                                    uVar15 = (0.0 < dVar44) + uVar15;
                                    bVar20 = bVar21;
                                    if (dVar44 < 1.0) {
                                      bVar20 = true;
                                    }
                                  } while ((0.0 < dVar44) &&
                                          (bVar2 = lVar38 < local_2a0, lVar38 = lVar38 + 1,
                                          bVar21 = bVar20, bVar2));
                                }
                                uVar40 = 2;
                                if ((int)uVar15 < 2) {
                                  uVar40 = (ulong)uVar15;
                                }
                                if (!bVar21) {
                                  uVar40 = (ulong)uVar15;
                                }
                                iVar37 = (int)uVar40;
                                if (iVar37 == 1) {
                                  if (bc_mode == Inhomogeneous) {
                                    local_440[lVar26 + (lVar22 - lVar14) * local_5e0.jstride] =
                                         local_450[(lVar22 - (long)local_448) * local_258.jstride];
                                  }
                                  else {
                                    local_440[lVar26 + (lVar22 - lVar14) * local_5e0.jstride] = 0.0;
                                  }
                                }
                                else {
                                  dVar44 = 0.0;
                                  if (1 < iVar37) {
                                    uVar24 = 1;
                                    do {
                                      dVar44 = dVar44 + local_440[(lVar22 - lVar14) *
                                                                  local_5e0.jstride +
                                                                  (long)(((int)local_568 -
                                                                         local_5e0.begin.x) +
                                                                        (int)uVar24)] *
                                                        *(double *)
                                                         (local_378.smallend.vect +
                                                         ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                      uVar24 = uVar24 + 1;
                                    } while (uVar40 != uVar24);
                                  }
                                  lVar38 = (lVar22 - lVar14) * local_5e0.jstride;
                                  local_440[lVar26 + lVar38] = dVar44;
                                  if (bc_mode == Inhomogeneous) {
                                    local_440[lVar26 + lVar38] =
                                         local_450[(lVar22 - (long)local_448) * local_258.jstride] *
                                         *(double *)
                                          (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                         dVar44;
                                  }
                                }
                              }
                              lVar22 = lVar22 + 1;
                            } while (local_54c != (int)lVar22);
                          }
                          local_590 = (double *)((long)local_590 + 1);
                          uVar24 = local_560;
                          uVar40 = local_4d8;
                        } while (local_56c != (int)local_590);
                      }
                    }
                    else if (iVar37 == 0x66) {
                      if ((int)local_5a0 <= iVar35) {
                        lVar14 = local_4b0.kstride * 4;
                        lVar22 = ((long)local_458 - (long)local_4b0.begin.z) * lVar14 +
                                 (local_528 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                                 (long)local_4b0.begin.x * -4;
                        lVar26 = (long)local_4b0.p + lVar22 + local_178;
                        lVar22 = (long)local_4b0.p + lVar22 + local_468;
                        pdVar33 = local_458;
                        do {
                          if (iVar5 <= iVar34) {
                            lVar36 = local_5e0.nstride * local_578 +
                                     (local_528 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                     ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride *
                                     8 + (long)local_5e0.begin.x * -8 + (long)local_5e0.p;
                            lVar38 = 0;
                            iVar37 = local_410;
                            do {
                              if ((*(int *)(lVar22 + lVar38) == 0) &&
                                 (*(int *)(lVar26 + lVar38) == 1)) {
                                *(undefined8 *)(lVar36 + local_2a8 * 8) =
                                     *(undefined8 *)(lVar36 + local_168 * 8);
                              }
                              lVar36 = lVar36 + local_5e0.jstride * 8;
                              lVar38 = lVar38 + local_4b0.jstride * 4;
                              iVar37 = iVar37 + -1;
                            } while (iVar37 != 0);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          lVar26 = lVar26 + lVar14;
                          lVar22 = lVar22 + lVar14;
                        } while (local_56c != (int)pdVar33);
                      }
                    }
                    else if ((iVar37 == 0x67) && ((int)local_5a0 <= iVar35)) {
                      lVar14 = local_4b0.kstride * 4;
                      lVar22 = ((long)local_458 - (long)local_4b0.begin.z) * lVar14 +
                               (local_528 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                               (long)local_4b0.begin.x * -4;
                      lVar26 = (long)local_4b0.p + lVar22 + local_178;
                      lVar22 = (long)local_4b0.p + lVar22 + local_468;
                      pdVar33 = local_458;
                      do {
                        if (iVar5 <= iVar34) {
                          lVar36 = local_5e0.nstride * local_578 +
                                   (local_528 - local_5e0.begin.y) * local_5e0.jstride * 8 +
                                   ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride * 8
                                   + (long)local_5e0.begin.x * -8 + (long)local_5e0.p;
                          lVar38 = 0;
                          iVar37 = local_410;
                          do {
                            if ((*(int *)(lVar22 + lVar38) == 0) && (*(int *)(lVar26 + lVar38) == 1)
                               ) {
                              *(ulong *)(lVar36 + local_2a8 * 8) =
                                   *(ulong *)(lVar36 + local_168 * 8) ^ 0x8000000000000000;
                            }
                            lVar36 = lVar36 + local_5e0.jstride * 8;
                            lVar38 = lVar38 + local_4b0.jstride * 4;
                            iVar37 = iVar37 + -1;
                          } while (iVar37 != 0);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar26 = lVar26 + lVar14;
                        lVar22 = lVar22 + lVar14;
                      } while (local_56c != (int)pdVar33);
                    }
                    if ((int)local_500 == 0x65) {
                      local_310[0] = -local_1d8 * local_200;
                      local_310[1] = 0.5;
                      local_310[2] = 1.5;
                      local_310[3] = 2.5;
                      local_328 = 0;
                      uStack_320 = 0;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0;
                      local_378.btype.itype = 0;
                      uStack_35c = 0;
                      local_378.smallend.vect[0] = 0;
                      local_378.smallend.vect[1] = 0;
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0;
                      if (1 < (int)local_408) {
                        lVar22 = 2;
                        uVar8 = 0;
                        do {
                          lVar14 = 0;
                          do {
                            lVar26 = 0;
                            dVar44 = dVar45;
                            dVar46 = dVar47;
                            do {
                              if (lVar14 != lVar26) {
                                dVar44 = dVar44 * (-0.5 - local_310[lVar26]);
                                dVar46 = dVar46 * (local_310[lVar14] - local_310[lVar26]);
                              }
                              lVar26 = lVar26 + 1;
                            } while (lVar22 != lVar26);
                            *(double *)((long)&local_378 + (uVar8 * 4 + lVar14) * 8) =
                                 dVar44 / dVar46;
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != lVar22);
                          uVar8 = uVar8 + 1;
                          lVar22 = lVar22 + 1;
                        } while (uVar8 != uVar40);
                      }
                      if ((int)local_588 <= iVar6) {
                        local_1d8 = (double)(long)local_4b0.begin.z;
                        local_1e0 = (double *)local_4b0.kstride;
                        local_548 = (double *)(long)(~local_4b0.begin.x + local_600);
                        pdVar33 = local_460;
                        do {
                          if ((int)local_580 <= iVar31) {
                            lVar26 = ((long)pdVar33 - (long)local_4b0.begin.z) * local_4b0.kstride;
                            local_590 = (double *)(long)local_3b8.begin.y;
                            local_508 = (double *)local_3b8.jstride;
                            local_500 = local_3b8.p +
                                        ((long)pdVar33 - (long)local_3b8.begin.z) *
                                        local_3b8.kstride;
                            lVar22 = (long)local_5e0.begin.y;
                            local_450 = local_5e0.p +
                                        ((long)pdVar33 - (long)local_5e0.begin.z) *
                                        local_5e0.kstride + local_5e0.nstride * local_4c0;
                            lVar14 = (long)local_600 - (long)local_5e0.begin.x;
                            local_510 = (double *)(long)local_298.begin.y;
                            local_4c8 = (double *)local_298.jstride;
                            local_448 = (double *)
                                        CONCAT44(local_448._4_4_,local_600 - local_3b8.begin.x);
                            local_4d0 = local_298.p +
                                        ((long)local_600 - (long)local_298.begin.x) +
                                        ((long)pdVar33 - (long)local_298.begin.z) *
                                        local_298.kstride + local_298.nstride * local_4c0;
                            local_440 = (double *)
                                        CONCAT44(local_440._4_4_,local_214 - local_5e0.begin.x);
                            pdVar42 = local_530;
                            do {
                              lVar36 = ((long)pdVar42 - (long)local_4b0.begin.y) * local_4b0.jstride
                              ;
                              if ((*(int *)((long)local_4b0.p +
                                           lVar26 * 4 +
                                           (long)(local_600 - local_4b0.begin.x) * 4 + lVar36 * 4)
                                   == 0) &&
                                 (*(int *)((long)local_4b0.p +
                                          lVar26 * 4 + (long)local_548 * 4 + lVar36 * 4) == 1)) {
                                if (iVar4 < 2) {
                                  uVar15 = 1;
                                  bVar21 = false;
                                }
                                else {
                                  uVar15 = 1;
                                  lVar36 = 0;
                                  iVar37 = local_600 - local_3b8.begin.x;
                                  bVar21 = false;
                                  do {
                                    dVar45 = local_500[((long)pdVar42 - (long)local_590) *
                                                       local_3b8.jstride + (long)iVar37];
                                    uVar15 = (0.0 < dVar45) + uVar15;
                                    bVar20 = bVar21;
                                    if (dVar45 < 1.0) {
                                      bVar20 = true;
                                    }
                                    if (dVar45 <= 0.0) break;
                                    iVar37 = iVar37 + -1;
                                    bVar2 = lVar36 < local_2a0;
                                    lVar36 = lVar36 + 1;
                                    bVar21 = bVar20;
                                  } while (bVar2);
                                }
                                uVar40 = 2;
                                if ((int)uVar15 < 2) {
                                  uVar40 = (ulong)uVar15;
                                }
                                if (!bVar21) {
                                  uVar40 = (ulong)uVar15;
                                }
                                iVar37 = (int)uVar40;
                                if (iVar37 == 1) {
                                  if (bc_mode == Inhomogeneous) {
                                    local_450[lVar14 + ((long)pdVar42 - lVar22) * local_5e0.jstride]
                                         = local_4d0[((long)pdVar42 - (long)local_510) *
                                                     local_298.jstride];
                                  }
                                  else {
                                    local_450[lVar14 + ((long)pdVar42 - lVar22) * local_5e0.jstride]
                                         = 0.0;
                                  }
                                }
                                else {
                                  dVar45 = 0.0;
                                  if (1 < iVar37) {
                                    uVar24 = 1;
                                    iVar35 = local_214 - local_5e0.begin.x;
                                    do {
                                      dVar45 = dVar45 + local_450[((long)pdVar42 - lVar22) *
                                                                  local_5e0.jstride + (long)iVar35]
                                                        * *(double *)
                                                           (local_378.smallend.vect +
                                                           ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                      uVar24 = uVar24 + 1;
                                      iVar35 = iVar35 + -1;
                                    } while (uVar40 != uVar24);
                                  }
                                  lVar36 = ((long)pdVar42 - lVar22) * local_5e0.jstride;
                                  local_450[lVar14 + lVar36] = dVar45;
                                  if (bc_mode == Inhomogeneous) {
                                    local_450[lVar14 + lVar36] =
                                         local_4d0[((long)pdVar42 - (long)local_510) *
                                                   local_298.jstride] *
                                         *(double *)
                                          (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                         dVar45;
                                  }
                                }
                              }
                              pdVar42 = (double *)((long)pdVar42 + 1);
                              uVar24 = local_560;
                            } while (local_550 != (int)pdVar42);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                        } while (local_570 != (int)pdVar33);
                      }
LAB_006144de:
                      uVar40 = local_4d8;
                    }
                    else if ((int)local_500 == 0x66) {
                      if ((int)local_588 <= iVar6) {
                        lVar14 = local_4b0.kstride * 4;
                        lVar22 = ((long)local_460 - (long)local_4b0.begin.z) * lVar14 +
                                 ((long)local_530 - (long)local_4b0.begin.y) * local_4b0.jstride * 4
                                 + (long)local_4b0.begin.x * -4;
                        lVar26 = (long)local_4b0.p + lVar22 + local_180;
                        lVar22 = (long)local_4b0.p + lVar22 + local_470;
                        pdVar33 = local_460;
                        do {
                          if ((int)local_580 <= iVar31) {
                            lVar36 = local_5e0.nstride * local_578 +
                                     ((long)local_530 - (long)local_5e0.begin.y) *
                                     local_5e0.jstride * 8 +
                                     ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride *
                                     8 + (long)local_5e0.begin.x * -8 + (long)local_5e0.p;
                            lVar38 = 0;
                            iVar37 = local_414;
                            do {
                              if ((*(int *)(lVar22 + lVar38) == 0) &&
                                 (*(int *)(lVar26 + lVar38) == 1)) {
                                *(undefined8 *)(lVar36 + local_2b0 * 8) =
                                     *(undefined8 *)(lVar36 + local_170 * 8);
                              }
                              lVar36 = lVar36 + local_5e0.jstride * 8;
                              lVar38 = lVar38 + local_4b0.jstride * 4;
                              iVar37 = iVar37 + -1;
                            } while (iVar37 != 0);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          lVar26 = lVar26 + lVar14;
                          lVar22 = lVar22 + lVar14;
                        } while (local_570 != (int)pdVar33);
                      }
                    }
                    else if (((int)local_500 == 0x67) && ((int)local_588 <= iVar6)) {
                      lVar14 = local_4b0.kstride * 4;
                      lVar22 = ((long)local_460 - (long)local_4b0.begin.z) * lVar14 +
                               ((long)local_530 - (long)local_4b0.begin.y) * local_4b0.jstride * 4 +
                               (long)local_4b0.begin.x * -4;
                      lVar26 = (long)local_4b0.p + lVar22 + local_180;
                      lVar22 = (long)local_4b0.p + lVar22 + local_470;
                      pdVar33 = local_460;
                      do {
                        if ((int)local_580 <= iVar31) {
                          lVar36 = local_5e0.nstride * local_578 +
                                   ((long)local_530 - (long)local_5e0.begin.y) *
                                   local_5e0.jstride * 8 +
                                   ((long)pdVar33 - (long)local_5e0.begin.z) * local_5e0.kstride * 8
                                   + (long)local_5e0.begin.x * -8 + (long)local_5e0.p;
                          lVar38 = 0;
                          iVar37 = local_414;
                          do {
                            if ((*(int *)(lVar22 + lVar38) == 0) && (*(int *)(lVar26 + lVar38) == 1)
                               ) {
                              *(ulong *)(lVar36 + local_2b0 * 8) =
                                   *(ulong *)(lVar36 + local_170 * 8) ^ 0x8000000000000000;
                            }
                            lVar36 = lVar36 + local_5e0.jstride * 8;
                            lVar38 = lVar38 + local_4b0.jstride * 4;
                            iVar37 = iVar37 + -1;
                          } while (iVar37 != 0);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar26 = lVar26 + lVar14;
                        lVar22 = lVar22 + lVar14;
                      } while (local_570 != (int)pdVar33);
                    }
                  }
                  else {
                    if (iVar37 == 0x65) {
                      local_310[0] = -(double)local_548 * local_210;
                      local_310[1] = 0.5;
                      local_310[2] = 1.5;
                      local_310[3] = 2.5;
                      local_328 = 0;
                      uStack_320 = 0;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0;
                      local_378.btype.itype = 0;
                      uStack_35c = 0;
                      local_378.smallend.vect[0] = 0;
                      local_378.smallend.vect[1] = 0;
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0;
                      if (1 < (int)local_408) {
                        lVar22 = 2;
                        uVar8 = 0;
                        do {
                          lVar14 = 0;
                          do {
                            lVar26 = 0;
                            dVar44 = dVar45;
                            dVar46 = dVar47;
                            do {
                              if (lVar14 != lVar26) {
                                dVar44 = dVar44 * (-0.5 - local_310[lVar26]);
                                dVar46 = dVar46 * (local_310[lVar14] - local_310[lVar26]);
                              }
                              lVar26 = lVar26 + 1;
                            } while (lVar22 != lVar26);
                            *(double *)((long)&local_378 + (uVar8 * 4 + lVar14) * 8) =
                                 dVar44 / dVar46;
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != lVar22);
                          uVar8 = uVar8 + 1;
                          lVar22 = lVar22 + 1;
                        } while (uVar8 != uVar40);
                      }
                      uVar40 = local_4d8;
                      if (iVar5 <= iVar34) {
                        local_4d0 = (double *)local_4b0.p;
                        local_450 = (double *)local_4b0.jstride;
                        local_440 = (double *)(long)local_4b0.begin.y;
                        local_548 = (double *)((local_558 - local_4b0.begin.z) * local_4b0.kstride);
                        local_5e8 = local_528;
                        do {
                          if ((int)local_568 <= iVar7) {
                            local_590 = (double *)(long)local_3b8.begin.x;
                            local_508 = local_3b8.p +
                                        (local_5e8 - local_3b8.begin.y) * local_3b8.jstride;
                            lVar14 = (long)local_5e0.begin.x;
                            local_448 = local_5e0.p +
                                        (local_5e8 - local_5e0.begin.y) * local_5e0.jstride +
                                        local_5e0.nstride * local_4c0;
                            lVar26 = ((long)(int)local_5a0 - (long)local_5e0.begin.z) *
                                     local_5e0.kstride;
                            local_510 = (double *)(long)local_258.begin.x;
                            local_4c8 = local_258.p +
                                        (local_5e8 - local_258.begin.y) * local_258.jstride +
                                        ((long)(int)local_5a0 - (long)local_258.begin.z) *
                                        local_258.kstride + local_258.nstride * local_4c0;
                            lVar22 = local_2a8;
                            do {
                              lVar36 = (lVar22 - local_4b0.begin.x) * 4 +
                                       (local_5e8 - (long)local_440) * local_4b0.jstride * 4;
                              if ((*(int *)((long)local_4b0.p +
                                           ((int)local_5a0 - local_4b0.begin.z) * local_4b0.kstride
                                           * 4 + lVar36) == 0) &&
                                 (*(int *)((long)local_4b0.p + (long)local_548 * 4 + lVar36) == 1))
                              {
                                if (iVar4 < 2) {
                                  uVar15 = 1;
                                  bVar21 = false;
                                }
                                else {
                                  uVar15 = 1;
                                  lVar36 = 0;
                                  bVar21 = false;
                                  do {
                                    dVar44 = local_508[(lVar22 - (long)local_590) +
                                                       ((local_558 - local_3b8.begin.z) +
                                                       (int)lVar36) * local_3b8.kstride];
                                    uVar15 = (0.0 < dVar44) + uVar15;
                                    bVar20 = bVar21;
                                    if (dVar44 < 1.0) {
                                      bVar20 = true;
                                    }
                                    uVar24 = local_560;
                                  } while ((0.0 < dVar44) &&
                                          (bVar2 = lVar36 < local_2a0, lVar36 = lVar36 + 1,
                                          bVar21 = bVar20, bVar2));
                                }
                                uVar40 = 2;
                                if ((int)uVar15 < 2) {
                                  uVar40 = (ulong)uVar15;
                                }
                                if (!bVar21) {
                                  uVar40 = (ulong)uVar15;
                                }
                                iVar37 = (int)uVar40;
                                if (iVar37 == 1) {
                                  if (bc_mode == Inhomogeneous) {
                                    local_448[lVar26 + (lVar22 - lVar14)] =
                                         local_4c8[lVar22 - (long)local_510];
                                  }
                                  else {
                                    local_448[lVar26 + (lVar22 - lVar14)] = 0.0;
                                  }
                                }
                                else {
                                  dVar44 = 0.0;
                                  if (1 < iVar37) {
                                    uVar24 = 1;
                                    do {
                                      dVar44 = dVar44 + local_448[(lVar22 - lVar14) +
                                                                  (((int)local_5a0 -
                                                                   local_5e0.begin.z) + (int)uVar24)
                                                                  * local_5e0.kstride] *
                                                        *(double *)
                                                         (local_378.smallend.vect +
                                                         ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                      uVar24 = uVar24 + 1;
                                    } while (uVar40 != uVar24);
                                  }
                                  local_448[lVar26 + (lVar22 - lVar14)] = dVar44;
                                  uVar24 = local_560;
                                  if (bc_mode == Inhomogeneous) {
                                    local_448[lVar26 + (lVar22 - lVar14)] =
                                         local_4c8[lVar22 - (long)local_510] *
                                         *(double *)
                                          (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                         dVar44;
                                  }
                                }
                              }
                              lVar22 = lVar22 + 1;
                            } while (iVar39 != (int)lVar22);
                          }
                          local_5e8 = local_5e8 + 1;
                          uVar40 = local_4d8;
                        } while (local_54c != (int)local_5e8);
                      }
                    }
                    else if (iVar37 == 0x66) {
                      if (iVar5 <= iVar34) {
                        lVar14 = local_4b0.jstride * 4;
                        lVar22 = (local_528 - local_4b0.begin.y) * lVar14;
                        lVar36 = (long)local_4b0.p +
                                 (long)(local_558 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                                 lVar22 + (long)local_4b0.begin.x * -4 + local_468;
                        lVar26 = (long)local_4b0.p +
                                 local_4b0.kstride * 4 * (long)((int)local_5a0 - local_4b0.begin.z)
                                 + lVar22 + (long)local_4b0.begin.x * -4 + local_468;
                        lVar22 = local_528;
                        do {
                          if ((int)local_568 <= iVar7) {
                            lVar41 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                            lVar38 = 0;
                            do {
                              if ((*(int *)(lVar26 + lVar38 * 4) == 0) &&
                                 (*(int *)(lVar36 + lVar38 * 4) == 1)) {
                                *(undefined8 *)
                                 ((long)local_5e0.p +
                                 lVar38 * 8 +
                                 (long)((int)local_5a0 - local_5e0.begin.z) * local_5e0.kstride * 8
                                 + lVar41 * 8 + local_5e0.nstride * local_578 +
                                 (long)local_5e0.begin.x * -8 + local_428) =
                                     *(undefined8 *)
                                      ((long)local_5e0.p +
                                      lVar38 * 8 +
                                      local_5e0.kstride * 8 * (long)(local_558 - local_5e0.begin.z)
                                      + lVar41 * 8 + local_5e0.nstride * local_578 +
                                      (long)local_5e0.begin.x * -8 + local_428);
                              }
                              lVar38 = lVar38 + 1;
                            } while (iVar23 != (int)lVar38);
                          }
                          lVar22 = lVar22 + 1;
                          lVar36 = lVar36 + lVar14;
                          lVar26 = lVar26 + lVar14;
                        } while (local_54c != (int)lVar22);
                      }
                    }
                    else if ((iVar37 == 0x67) && (iVar5 <= iVar34)) {
                      lVar14 = local_4b0.jstride * 4;
                      lVar22 = (local_528 - local_4b0.begin.y) * lVar14;
                      lVar36 = (long)local_4b0.p +
                               (long)(local_558 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                               lVar22 + (long)local_4b0.begin.x * -4 + local_468;
                      lVar26 = (long)local_4b0.p +
                               local_4b0.kstride * 4 * (long)((int)local_5a0 - local_4b0.begin.z) +
                               lVar22 + (long)local_4b0.begin.x * -4 + local_468;
                      lVar22 = local_528;
                      do {
                        if ((int)local_568 <= iVar7) {
                          lVar41 = (lVar22 - local_5e0.begin.y) * local_5e0.jstride;
                          lVar38 = 0;
                          do {
                            if ((*(int *)(lVar26 + lVar38 * 4) == 0) &&
                               (*(int *)(lVar36 + lVar38 * 4) == 1)) {
                              *(ulong *)((long)local_5e0.p +
                                        lVar38 * 8 +
                                        (long)((int)local_5a0 - local_5e0.begin.z) *
                                        local_5e0.kstride * 8 + lVar41 * 8 +
                                        local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8
                                        + local_428) =
                                   *(ulong *)((long)local_5e0.p +
                                             lVar38 * 8 +
                                             local_5e0.kstride * 8 *
                                             (long)(local_558 - local_5e0.begin.z) + lVar41 * 8 +
                                             local_5e0.nstride * local_578 +
                                             (long)local_5e0.begin.x * -8 + local_428) ^
                                   0x8000000000000000;
                            }
                            lVar38 = lVar38 + 1;
                          } while (iVar23 != (int)lVar38);
                        }
                        lVar22 = lVar22 + 1;
                        lVar36 = lVar36 + lVar14;
                        lVar26 = lVar26 + lVar14;
                      } while (local_54c != (int)lVar22);
                    }
                    if ((int)local_500 == 0x65) {
                      local_310[0] = -local_1d8 * local_210;
                      local_310[1] = 0.5;
                      local_310[2] = 1.5;
                      local_310[3] = 2.5;
                      local_328 = 0;
                      uStack_320 = 0;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_378.bigend.vect[1] = 0;
                      local_378.bigend.vect[2] = 0;
                      local_378.btype.itype = 0;
                      uStack_35c = 0;
                      local_378.smallend.vect[0] = 0;
                      local_378.smallend.vect[1] = 0;
                      local_378.smallend.vect[2] = 0;
                      local_378.bigend.vect[0] = 0;
                      if (1 < (int)local_408) {
                        lVar22 = 2;
                        uVar8 = 0;
                        do {
                          lVar14 = 0;
                          do {
                            lVar26 = 0;
                            dVar44 = dVar45;
                            dVar46 = dVar47;
                            do {
                              if (lVar14 != lVar26) {
                                dVar44 = dVar44 * (-0.5 - local_310[lVar26]);
                                dVar46 = dVar46 * (local_310[lVar14] - local_310[lVar26]);
                              }
                              lVar26 = lVar26 + 1;
                            } while (lVar22 != lVar26);
                            *(double *)((long)&local_378 + (uVar8 * 4 + lVar14) * 8) =
                                 dVar44 / dVar46;
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != lVar22);
                          uVar8 = uVar8 + 1;
                          lVar22 = lVar22 + 1;
                        } while (uVar8 != uVar40);
                      }
                      if ((int)local_580 <= iVar31) {
                        local_4d0 = (double *)local_4b0.p;
                        local_450 = (double *)local_4b0.jstride;
                        local_440 = (double *)(long)local_4b0.begin.y;
                        local_548 = (double *)
                                    ((~local_4b0.begin.z + (int)local_588) * local_4b0.kstride);
                        pdVar33 = local_530;
                        do {
                          if (local_600 <= iVar13) {
                            local_590 = local_3b8.p +
                                        ((long)pdVar33 - (long)local_3b8.begin.y) *
                                        local_3b8.jstride;
                            lVar14 = (long)local_5e0.begin.x;
                            local_4c8 = local_5e0.p +
                                        ((long)pdVar33 - (long)local_5e0.begin.y) *
                                        local_5e0.jstride + local_5e0.nstride * local_4c0;
                            lVar26 = ((long)(int)local_588 - (long)local_5e0.begin.z) *
                                     local_5e0.kstride;
                            local_500 = (double *)(long)local_298.begin.x;
                            local_508 = (double *)
                                        CONCAT44(local_508._4_4_,(int)local_588 - local_3b8.begin.z)
                            ;
                            local_510 = local_298.p +
                                        ((long)pdVar33 - (long)local_298.begin.y) *
                                        local_298.jstride +
                                        ((long)(int)local_588 - (long)local_298.begin.z) *
                                        local_298.kstride + local_298.nstride * local_4c0;
                            local_448 = (double *)
                                        CONCAT44(local_448._4_4_,local_4b8 - local_5e0.begin.z);
                            lVar22 = local_2b0;
                            do {
                              lVar36 = (lVar22 - local_4b0.begin.x) * 4 +
                                       ((long)pdVar33 - (long)local_440) * local_4b0.jstride * 4;
                              if ((*(int *)((long)local_4b0.p +
                                           ((int)local_588 - local_4b0.begin.z) * local_4b0.kstride
                                           * 4 + lVar36) == 0) &&
                                 (*(int *)((long)local_4b0.p + (long)local_548 * 4 + lVar36) == 1))
                              {
                                if (iVar4 < 2) {
                                  uVar15 = 1;
                                  bVar21 = false;
                                }
                                else {
                                  uVar15 = 1;
                                  lVar36 = 0;
                                  iVar37 = (int)local_588 - local_3b8.begin.z;
                                  bVar21 = false;
                                  do {
                                    dVar45 = local_590[(lVar22 - local_3b8.begin.x) +
                                                       iVar37 * local_3b8.kstride];
                                    uVar15 = (0.0 < dVar45) + uVar15;
                                    bVar20 = bVar21;
                                    if (dVar45 < 1.0) {
                                      bVar20 = true;
                                    }
                                    uVar24 = local_560;
                                    if (dVar45 <= 0.0) break;
                                    iVar37 = iVar37 + -1;
                                    bVar2 = lVar36 < local_2a0;
                                    lVar36 = lVar36 + 1;
                                    bVar21 = bVar20;
                                  } while (bVar2);
                                }
                                uVar40 = 2;
                                if ((int)uVar15 < 2) {
                                  uVar40 = (ulong)uVar15;
                                }
                                if (!bVar21) {
                                  uVar40 = (ulong)uVar15;
                                }
                                iVar37 = (int)uVar40;
                                if (iVar37 == 1) {
                                  if (bc_mode == Inhomogeneous) {
                                    local_4c8[lVar26 + (lVar22 - lVar14)] =
                                         local_510[lVar22 - (long)local_500];
                                  }
                                  else {
                                    local_4c8[lVar26 + (lVar22 - lVar14)] = 0.0;
                                  }
                                }
                                else {
                                  dVar45 = 0.0;
                                  if (1 < iVar37) {
                                    uVar24 = 1;
                                    iVar35 = local_4b8 - local_5e0.begin.z;
                                    do {
                                      dVar45 = dVar45 + local_4c8[(lVar22 - lVar14) +
                                                                  local_5e0.kstride * iVar35] *
                                                        *(double *)
                                                         (local_378.smallend.vect +
                                                         ((long)(iVar37 * 4 + -8) + uVar24) * 2);
                                      uVar24 = uVar24 + 1;
                                      iVar35 = iVar35 + -1;
                                    } while (uVar40 != uVar24);
                                  }
                                  local_4c8[lVar26 + (lVar22 - lVar14)] = dVar45;
                                  uVar24 = local_560;
                                  if (bc_mode == Inhomogeneous) {
                                    local_4c8[lVar26 + (lVar22 - lVar14)] =
                                         local_510[lVar22 - (long)local_500] *
                                         *(double *)
                                          (local_378.smallend.vect + (long)(iVar37 * 4 + -8) * 2) +
                                         dVar45;
                                  }
                                }
                              }
                              lVar22 = lVar22 + 1;
                            } while (local_40c != (int)lVar22);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                        } while (local_550 != (int)pdVar33);
                      }
                      goto LAB_006144de;
                    }
                    if ((int)local_500 == 0x66) {
                      if ((int)local_580 <= iVar31) {
                        lVar22 = local_4b0.jstride * 4;
                        lVar14 = ((long)local_530 - (long)local_4b0.begin.y) * lVar22;
                        lVar26 = (long)local_4b0.p +
                                 (long)(local_4b8 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                                 lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                        lVar14 = (long)local_4b0.p +
                                 local_4b0.kstride * 4 * (long)((int)local_588 - local_4b0.begin.z)
                                 + lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                        pdVar33 = local_530;
                        do {
                          if (local_600 <= iVar13) {
                            lVar38 = ((long)pdVar33 - (long)local_5e0.begin.y) * local_5e0.jstride;
                            lVar36 = 0;
                            do {
                              if ((*(int *)(lVar14 + lVar36 * 4) == 0) &&
                                 (*(int *)(lVar26 + lVar36 * 4) == 1)) {
                                *(undefined8 *)
                                 ((long)local_5e0.p +
                                 lVar36 * 8 +
                                 (long)((int)local_588 - local_5e0.begin.z) * local_5e0.kstride * 8
                                 + lVar38 * 8 + local_5e0.nstride * local_578 +
                                 (long)local_5e0.begin.x * -8 + local_430) =
                                     *(undefined8 *)
                                      ((long)local_5e0.p +
                                      lVar36 * 8 +
                                      local_5e0.kstride * 8 * (long)(local_4b8 - local_5e0.begin.z)
                                      + lVar38 * 8 + local_5e0.nstride * local_578 +
                                      (long)local_5e0.begin.x * -8 + local_430);
                              }
                              lVar36 = lVar36 + 1;
                            } while (iVar25 != (int)lVar36);
                          }
                          pdVar33 = (double *)((long)pdVar33 + 1);
                          lVar26 = lVar26 + lVar22;
                          lVar14 = lVar14 + lVar22;
                        } while (local_550 != (int)pdVar33);
                      }
                    }
                    else if (((int)local_500 == 0x67) && ((int)local_580 <= iVar31)) {
                      lVar22 = local_4b0.jstride * 4;
                      lVar14 = ((long)local_530 - (long)local_4b0.begin.y) * lVar22;
                      lVar26 = (long)local_4b0.p +
                               (long)(local_4b8 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                               lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar14 = (long)local_4b0.p +
                               local_4b0.kstride * 4 * (long)((int)local_588 - local_4b0.begin.z) +
                               lVar14 + (long)local_4b0.begin.x * -4 + local_470;
                      pdVar33 = local_530;
                      do {
                        if (local_600 <= iVar13) {
                          lVar38 = ((long)pdVar33 - (long)local_5e0.begin.y) * local_5e0.jstride;
                          lVar36 = 0;
                          do {
                            if ((*(int *)(lVar14 + lVar36 * 4) == 0) &&
                               (*(int *)(lVar26 + lVar36 * 4) == 1)) {
                              *(ulong *)((long)local_5e0.p +
                                        lVar36 * 8 +
                                        (long)((int)local_588 - local_5e0.begin.z) *
                                        local_5e0.kstride * 8 + lVar38 * 8 +
                                        local_5e0.nstride * local_578 + (long)local_5e0.begin.x * -8
                                        + local_430) =
                                   *(ulong *)((long)local_5e0.p +
                                             lVar36 * 8 +
                                             local_5e0.kstride * 8 *
                                             (long)(local_4b8 - local_5e0.begin.z) + lVar38 * 8 +
                                             local_5e0.nstride * local_578 +
                                             (long)local_5e0.begin.x * -8 + local_430) ^
                                   0x8000000000000000;
                            }
                            lVar36 = lVar36 + 1;
                          } while (iVar25 != (int)lVar36);
                        }
                        pdVar33 = (double *)((long)pdVar33 + 1);
                        lVar26 = lVar26 + lVar22;
                        lVar14 = lVar14 + lVar22;
                      } while (local_550 != (int)pdVar33);
                    }
                  }
                }
              }
              uVar8 = local_4c0 + 1;
              local_578 = local_578 + 8;
            } while (uVar8 != local_120);
          }
          lVar22 = local_438 + 1;
        } while (lVar22 != 3);
      }
      MFIter::operator++(&local_108);
    } while (local_108.currentIndex < local_108.endIndex);
  }
  MFIter::~MFIter(&local_108);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
MLEBABecLap::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode s_mode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLEBABecLap::applyBC()");

    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    if (!skip_fillboundary) {
        const int cross = false;
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int m_is_inhomog = bc_mode == BCMode::Inhomogeneous;
    int flagbc = m_is_inhomog;
    m_is_eb_inhomog = s_mode == StateMode::Solution;
    const int imaxorder = maxorder;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(imaxorder <= 4, "MLEBABecLap::applyBC: maxorder too high");

    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : 1.0;
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : 1.0;

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    const auto& ccmask = m_cc_mask[amrlev][mglev];

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx   = mfi.validbox();
        const auto& iofab = in.array(mfi);

        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
        if (fabtyp != FabType::covered)
        {
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                Box blo = amrex::adjCellLo(vbx, idim);
                Box bhi = amrex::adjCellHi(vbx, idim);
                if (fabtyp != FabType::regular) {
                    blo.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                    bhi.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                }
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (fabtyp == FabType::regular)
                    {
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_x(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_x(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_y(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_y(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_z(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_z(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                    else // irregular
                    {
                        const auto& ap = area[idim]->const_array(mfi);
                        const auto& mask = ccmask.const_array(mfi);
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_x(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_x(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_y(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_y(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_z(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_z(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                }
            }
        }
    }
}